

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

int gladLoadGLES2Loader(GLADloadproc load)

{
  char *__s;
  int iVar1;
  undefined8 in_RAX;
  GLubyte *pGVar2;
  size_t __n;
  uint uVar3;
  long lVar4;
  int local_38;
  int major;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  _local_38 = in_RAX;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  uVar3 = 0;
  if ((glad_glGetString != (PFNGLGETSTRINGPROC)0x0) &&
     (pGVar2 = (*glad_glGetString)(0x1f02), pGVar2 != (GLubyte *)0x0)) {
    pGVar2 = (*glad_glGetString)(0x1f02);
    if (pGVar2 != (GLubyte *)0x0) {
      lVar4 = 0;
      do {
        if (lVar4 == 0x18) goto LAB_00118d75;
        __s = *(char **)((long)&PTR_anon_var_dwarf_1ce1b_00168530 + lVar4);
        __n = strlen(__s);
        iVar1 = strncmp((char *)pGVar2,__s,__n);
        lVar4 = lVar4 + 8;
      } while (iVar1 != 0);
      pGVar2 = pGVar2 + __n;
LAB_00118d75:
      __isoc99_sscanf(pGVar2,"%d.%d",&major,&stack0xffffffffffffffc8);
      GLVersion.minor = local_38;
      GLVersion.major = major;
      uVar3 = (uint)(3 < major);
      GLAD_GL_ES_VERSION_3_0 = uVar3;
      if (-1 < local_38) {
        GLAD_GL_ES_VERSION_3_0 = 1;
      }
      GLAD_GL_ES_VERSION_3_1 = 1;
      if (local_38 < 1) {
        GLAD_GL_ES_VERSION_3_1 = uVar3;
      }
      if (major != 3) {
        GLAD_GL_ES_VERSION_3_0 = uVar3;
      }
      if (major != 3) {
        GLAD_GL_ES_VERSION_3_1 = uVar3;
      }
      GLAD_GL_ES_VERSION_2_0 = (int)(2 < major || -1 < local_38 && major == 2);
    }
    if (GLAD_GL_ES_VERSION_2_0 != 0) {
      glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)(*load)("glActiveTexture");
      glad_glAttachShader = (PFNGLATTACHSHADERPROC)(*load)("glAttachShader");
      glad_glBindAttribLocation = (PFNGLBINDATTRIBLOCATIONPROC)(*load)("glBindAttribLocation");
      glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*load)("glBindBuffer");
      glad_glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)(*load)("glBindFramebuffer");
      glad_glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)(*load)("glBindRenderbuffer");
      glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*load)("glBindTexture");
      glad_glBlendColor = (PFNGLBLENDCOLORPROC)(*load)("glBlendColor");
      glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)(*load)("glBlendEquation");
      glad_glBlendEquationSeparate =
           (PFNGLBLENDEQUATIONSEPARATEPROC)(*load)("glBlendEquationSeparate");
      glad_glBlendFunc = (PFNGLBLENDFUNCPROC)(*load)("glBlendFunc");
      glad_glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)(*load)("glBlendFuncSeparate");
      glad_glBufferData = (PFNGLBUFFERDATAPROC)(*load)("glBufferData");
      glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*load)("glBufferSubData");
      glad_glCheckFramebufferStatus =
           (PFNGLCHECKFRAMEBUFFERSTATUSPROC)(*load)("glCheckFramebufferStatus");
      glad_glClear = (PFNGLCLEARPROC)(*load)("glClear");
      glad_glClearColor = (PFNGLCLEARCOLORPROC)(*load)("glClearColor");
      glad_glClearDepthf = (PFNGLCLEARDEPTHFPROC)(*load)("glClearDepthf");
      glad_glClearStencil = (PFNGLCLEARSTENCILPROC)(*load)("glClearStencil");
      glad_glColorMask = (PFNGLCOLORMASKPROC)(*load)("glColorMask");
      glad_glCompileShader = (PFNGLCOMPILESHADERPROC)(*load)("glCompileShader");
      glad_glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*load)("glCompressedTexImage2D")
      ;
      glad_glCompressedTexSubImage2D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*load)("glCompressedTexSubImage2D");
      glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*load)("glCopyTexImage2D");
      glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*load)("glCopyTexSubImage2D");
      glad_glCreateProgram = (PFNGLCREATEPROGRAMPROC)(*load)("glCreateProgram");
      glad_glCreateShader = (PFNGLCREATESHADERPROC)(*load)("glCreateShader");
      glad_glCullFace = (PFNGLCULLFACEPROC)(*load)("glCullFace");
      glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*load)("glDeleteBuffers");
      glad_glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)(*load)("glDeleteFramebuffers");
      glad_glDeleteProgram = (PFNGLDELETEPROGRAMPROC)(*load)("glDeleteProgram");
      glad_glDeleteRenderbuffers = (PFNGLDELETERENDERBUFFERSPROC)(*load)("glDeleteRenderbuffers");
      glad_glDeleteShader = (PFNGLDELETESHADERPROC)(*load)("glDeleteShader");
      glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*load)("glDeleteTextures");
      glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)(*load)("glDepthFunc");
      glad_glDepthMask = (PFNGLDEPTHMASKPROC)(*load)("glDepthMask");
      glad_glDepthRangef = (PFNGLDEPTHRANGEFPROC)(*load)("glDepthRangef");
      glad_glDetachShader = (PFNGLDETACHSHADERPROC)(*load)("glDetachShader");
      glad_glDisable = (PFNGLDISABLEPROC)(*load)("glDisable");
      glad_glDisableVertexAttribArray =
           (PFNGLDISABLEVERTEXATTRIBARRAYPROC)(*load)("glDisableVertexAttribArray");
      glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*load)("glDrawArrays");
      glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*load)("glDrawElements");
      glad_glEnable = (PFNGLENABLEPROC)(*load)("glEnable");
      glad_glEnableVertexAttribArray =
           (PFNGLENABLEVERTEXATTRIBARRAYPROC)(*load)("glEnableVertexAttribArray");
      glad_glFinish = (PFNGLFINISHPROC)(*load)("glFinish");
      glad_glFlush = (PFNGLFLUSHPROC)(*load)("glFlush");
      glad_glFramebufferRenderbuffer =
           (PFNGLFRAMEBUFFERRENDERBUFFERPROC)(*load)("glFramebufferRenderbuffer");
      glad_glFramebufferTexture2D = (PFNGLFRAMEBUFFERTEXTURE2DPROC)(*load)("glFramebufferTexture2D")
      ;
      glad_glFrontFace = (PFNGLFRONTFACEPROC)(*load)("glFrontFace");
      glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*load)("glGenBuffers");
      glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)(*load)("glGenerateMipmap");
      glad_glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)(*load)("glGenFramebuffers");
      glad_glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)(*load)("glGenRenderbuffers");
      glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*load)("glGenTextures");
      glad_glGetActiveAttrib = (PFNGLGETACTIVEATTRIBPROC)(*load)("glGetActiveAttrib");
      glad_glGetActiveUniform = (PFNGLGETACTIVEUNIFORMPROC)(*load)("glGetActiveUniform");
      glad_glGetAttachedShaders = (PFNGLGETATTACHEDSHADERSPROC)(*load)("glGetAttachedShaders");
      glad_glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)(*load)("glGetAttribLocation");
      glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)(*load)("glGetBooleanv");
      glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC)(*load)("glGetBufferParameteriv")
      ;
      glad_glGetError = (PFNGLGETERRORPROC)(*load)("glGetError");
      glad_glGetFloatv = (PFNGLGETFLOATVPROC)(*load)("glGetFloatv");
      glad_glGetFramebufferAttachmentParameteriv =
           (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
           (*load)("glGetFramebufferAttachmentParameteriv");
      glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)(*load)("glGetIntegerv");
      glad_glGetProgramiv = (PFNGLGETPROGRAMIVPROC)(*load)("glGetProgramiv");
      glad_glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)(*load)("glGetProgramInfoLog");
      glad_glGetRenderbufferParameteriv =
           (PFNGLGETRENDERBUFFERPARAMETERIVPROC)(*load)("glGetRenderbufferParameteriv");
      glad_glGetShaderiv = (PFNGLGETSHADERIVPROC)(*load)("glGetShaderiv");
      glad_glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)(*load)("glGetShaderInfoLog");
      glad_glGetShaderPrecisionFormat =
           (PFNGLGETSHADERPRECISIONFORMATPROC)(*load)("glGetShaderPrecisionFormat");
      glad_glGetShaderSource = (PFNGLGETSHADERSOURCEPROC)(*load)("glGetShaderSource");
      glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
      glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)(*load)("glGetTexParameterfv");
      glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)(*load)("glGetTexParameteriv");
      glad_glGetUniformfv = (PFNGLGETUNIFORMFVPROC)(*load)("glGetUniformfv");
      glad_glGetUniformiv = (PFNGLGETUNIFORMIVPROC)(*load)("glGetUniformiv");
      glad_glGetUniformLocation = (PFNGLGETUNIFORMLOCATIONPROC)(*load)("glGetUniformLocation");
      glad_glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC)(*load)("glGetVertexAttribfv");
      glad_glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC)(*load)("glGetVertexAttribiv");
      glad_glGetVertexAttribPointerv =
           (PFNGLGETVERTEXATTRIBPOINTERVPROC)(*load)("glGetVertexAttribPointerv");
      glad_glHint = (PFNGLHINTPROC)(*load)("glHint");
      glad_glIsBuffer = (PFNGLISBUFFERPROC)(*load)("glIsBuffer");
      glad_glIsEnabled = (PFNGLISENABLEDPROC)(*load)("glIsEnabled");
      glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)(*load)("glIsFramebuffer");
      glad_glIsProgram = (PFNGLISPROGRAMPROC)(*load)("glIsProgram");
      glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)(*load)("glIsRenderbuffer");
      glad_glIsShader = (PFNGLISSHADERPROC)(*load)("glIsShader");
      glad_glIsTexture = (PFNGLISTEXTUREPROC)(*load)("glIsTexture");
      glad_glLineWidth = (PFNGLLINEWIDTHPROC)(*load)("glLineWidth");
      glad_glLinkProgram = (PFNGLLINKPROGRAMPROC)(*load)("glLinkProgram");
      glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)(*load)("glPixelStorei");
      glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*load)("glPolygonOffset");
      glad_glReadPixels = (PFNGLREADPIXELSPROC)(*load)("glReadPixels");
      glad_glReleaseShaderCompiler =
           (PFNGLRELEASESHADERCOMPILERPROC)(*load)("glReleaseShaderCompiler");
      glad_glRenderbufferStorage = (PFNGLRENDERBUFFERSTORAGEPROC)(*load)("glRenderbufferStorage");
      glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)(*load)("glSampleCoverage");
      glad_glScissor = (PFNGLSCISSORPROC)(*load)("glScissor");
      glad_glShaderBinary = (PFNGLSHADERBINARYPROC)(*load)("glShaderBinary");
      glad_glShaderSource = (PFNGLSHADERSOURCEPROC)(*load)("glShaderSource");
      glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)(*load)("glStencilFunc");
      glad_glStencilFuncSeparate = (PFNGLSTENCILFUNCSEPARATEPROC)(*load)("glStencilFuncSeparate");
      glad_glStencilMask = (PFNGLSTENCILMASKPROC)(*load)("glStencilMask");
      glad_glStencilMaskSeparate = (PFNGLSTENCILMASKSEPARATEPROC)(*load)("glStencilMaskSeparate");
      glad_glStencilOp = (PFNGLSTENCILOPPROC)(*load)("glStencilOp");
      glad_glStencilOpSeparate = (PFNGLSTENCILOPSEPARATEPROC)(*load)("glStencilOpSeparate");
      glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*load)("glTexImage2D");
      glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)(*load)("glTexParameterf");
      glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)(*load)("glTexParameterfv");
      glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*load)("glTexParameteri");
      glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)(*load)("glTexParameteriv");
      glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*load)("glTexSubImage2D");
      glad_glUniform1f = (PFNGLUNIFORM1FPROC)(*load)("glUniform1f");
      glad_glUniform1fv = (PFNGLUNIFORM1FVPROC)(*load)("glUniform1fv");
      glad_glUniform1i = (PFNGLUNIFORM1IPROC)(*load)("glUniform1i");
      glad_glUniform1iv = (PFNGLUNIFORM1IVPROC)(*load)("glUniform1iv");
      glad_glUniform2f = (PFNGLUNIFORM2FPROC)(*load)("glUniform2f");
      glad_glUniform2fv = (PFNGLUNIFORM2FVPROC)(*load)("glUniform2fv");
      glad_glUniform2i = (PFNGLUNIFORM2IPROC)(*load)("glUniform2i");
      glad_glUniform2iv = (PFNGLUNIFORM2IVPROC)(*load)("glUniform2iv");
      glad_glUniform3f = (PFNGLUNIFORM3FPROC)(*load)("glUniform3f");
      glad_glUniform3fv = (PFNGLUNIFORM3FVPROC)(*load)("glUniform3fv");
      glad_glUniform3i = (PFNGLUNIFORM3IPROC)(*load)("glUniform3i");
      glad_glUniform3iv = (PFNGLUNIFORM3IVPROC)(*load)("glUniform3iv");
      glad_glUniform4f = (PFNGLUNIFORM4FPROC)(*load)("glUniform4f");
      glad_glUniform4fv = (PFNGLUNIFORM4FVPROC)(*load)("glUniform4fv");
      glad_glUniform4i = (PFNGLUNIFORM4IPROC)(*load)("glUniform4i");
      glad_glUniform4iv = (PFNGLUNIFORM4IVPROC)(*load)("glUniform4iv");
      glad_glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)(*load)("glUniformMatrix2fv");
      glad_glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)(*load)("glUniformMatrix3fv");
      glad_glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)(*load)("glUniformMatrix4fv");
      glad_glUseProgram = (PFNGLUSEPROGRAMPROC)(*load)("glUseProgram");
      glad_glValidateProgram = (PFNGLVALIDATEPROGRAMPROC)(*load)("glValidateProgram");
      glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)(*load)("glVertexAttrib1f");
      glad_glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC)(*load)("glVertexAttrib1fv");
      glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)(*load)("glVertexAttrib2f");
      glad_glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC)(*load)("glVertexAttrib2fv");
      glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)(*load)("glVertexAttrib3f");
      glad_glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC)(*load)("glVertexAttrib3fv");
      glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)(*load)("glVertexAttrib4f");
      glad_glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC)(*load)("glVertexAttrib4fv");
      glad_glVertexAttribPointer = (PFNGLVERTEXATTRIBPOINTERPROC)(*load)("glVertexAttribPointer");
      glad_glViewport = (PFNGLVIEWPORTPROC)(*load)("glViewport");
    }
    if (GLAD_GL_ES_VERSION_3_0 != 0) {
      glad_glReadBuffer = (PFNGLREADBUFFERPROC)(*load)("glReadBuffer");
      glad_glDrawRangeElements = (PFNGLDRAWRANGEELEMENTSPROC)(*load)("glDrawRangeElements");
      glad_glTexImage3D = (PFNGLTEXIMAGE3DPROC)(*load)("glTexImage3D");
      glad_glTexSubImage3D = (PFNGLTEXSUBIMAGE3DPROC)(*load)("glTexSubImage3D");
      glad_glCopyTexSubImage3D = (PFNGLCOPYTEXSUBIMAGE3DPROC)(*load)("glCopyTexSubImage3D");
      glad_glCompressedTexImage3D = (PFNGLCOMPRESSEDTEXIMAGE3DPROC)(*load)("glCompressedTexImage3D")
      ;
      glad_glCompressedTexSubImage3D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)(*load)("glCompressedTexSubImage3D");
      glad_glGenQueries = (PFNGLGENQUERIESPROC)(*load)("glGenQueries");
      glad_glDeleteQueries = (PFNGLDELETEQUERIESPROC)(*load)("glDeleteQueries");
      glad_glIsQuery = (PFNGLISQUERYPROC)(*load)("glIsQuery");
      glad_glBeginQuery = (PFNGLBEGINQUERYPROC)(*load)("glBeginQuery");
      glad_glEndQuery = (PFNGLENDQUERYPROC)(*load)("glEndQuery");
      glad_glGetQueryiv = (PFNGLGETQUERYIVPROC)(*load)("glGetQueryiv");
      glad_glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC)(*load)("glGetQueryObjectuiv");
      glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)(*load)("glUnmapBuffer");
      glad_glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC)(*load)("glGetBufferPointerv");
      glad_glDrawBuffers = (PFNGLDRAWBUFFERSPROC)(*load)("glDrawBuffers");
      glad_glUniformMatrix2x3fv = (PFNGLUNIFORMMATRIX2X3FVPROC)(*load)("glUniformMatrix2x3fv");
      glad_glUniformMatrix3x2fv = (PFNGLUNIFORMMATRIX3X2FVPROC)(*load)("glUniformMatrix3x2fv");
      glad_glUniformMatrix2x4fv = (PFNGLUNIFORMMATRIX2X4FVPROC)(*load)("glUniformMatrix2x4fv");
      glad_glUniformMatrix4x2fv = (PFNGLUNIFORMMATRIX4X2FVPROC)(*load)("glUniformMatrix4x2fv");
      glad_glUniformMatrix3x4fv = (PFNGLUNIFORMMATRIX3X4FVPROC)(*load)("glUniformMatrix3x4fv");
      glad_glUniformMatrix4x3fv = (PFNGLUNIFORMMATRIX4X3FVPROC)(*load)("glUniformMatrix4x3fv");
      glad_glBlitFramebuffer = (PFNGLBLITFRAMEBUFFERPROC)(*load)("glBlitFramebuffer");
      glad_glRenderbufferStorageMultisample =
           (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)(*load)("glRenderbufferStorageMultisample");
      glad_glFramebufferTextureLayer =
           (PFNGLFRAMEBUFFERTEXTURELAYERPROC)(*load)("glFramebufferTextureLayer");
      glad_glMapBufferRange = (PFNGLMAPBUFFERRANGEPROC)(*load)("glMapBufferRange");
      glad_glFlushMappedBufferRange =
           (PFNGLFLUSHMAPPEDBUFFERRANGEPROC)(*load)("glFlushMappedBufferRange");
      glad_glBindVertexArray = (PFNGLBINDVERTEXARRAYPROC)(*load)("glBindVertexArray");
      glad_glDeleteVertexArrays = (PFNGLDELETEVERTEXARRAYSPROC)(*load)("glDeleteVertexArrays");
      glad_glGenVertexArrays = (PFNGLGENVERTEXARRAYSPROC)(*load)("glGenVertexArrays");
      glad_glIsVertexArray = (PFNGLISVERTEXARRAYPROC)(*load)("glIsVertexArray");
      glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)("glGetIntegeri_v");
      glad_glBeginTransformFeedback =
           (PFNGLBEGINTRANSFORMFEEDBACKPROC)(*load)("glBeginTransformFeedback");
      glad_glEndTransformFeedback = (PFNGLENDTRANSFORMFEEDBACKPROC)(*load)("glEndTransformFeedback")
      ;
      glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange");
      glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase");
      glad_glTransformFeedbackVaryings =
           (PFNGLTRANSFORMFEEDBACKVARYINGSPROC)(*load)("glTransformFeedbackVaryings");
      glad_glGetTransformFeedbackVarying =
           (PFNGLGETTRANSFORMFEEDBACKVARYINGPROC)(*load)("glGetTransformFeedbackVarying");
      glad_glVertexAttribIPointer = (PFNGLVERTEXATTRIBIPOINTERPROC)(*load)("glVertexAttribIPointer")
      ;
      glad_glGetVertexAttribIiv = (PFNGLGETVERTEXATTRIBIIVPROC)(*load)("glGetVertexAttribIiv");
      glad_glGetVertexAttribIuiv = (PFNGLGETVERTEXATTRIBIUIVPROC)(*load)("glGetVertexAttribIuiv");
      glad_glVertexAttribI4i = (PFNGLVERTEXATTRIBI4IPROC)(*load)("glVertexAttribI4i");
      glad_glVertexAttribI4ui = (PFNGLVERTEXATTRIBI4UIPROC)(*load)("glVertexAttribI4ui");
      glad_glVertexAttribI4iv = (PFNGLVERTEXATTRIBI4IVPROC)(*load)("glVertexAttribI4iv");
      glad_glVertexAttribI4uiv = (PFNGLVERTEXATTRIBI4UIVPROC)(*load)("glVertexAttribI4uiv");
      glad_glGetUniformuiv = (PFNGLGETUNIFORMUIVPROC)(*load)("glGetUniformuiv");
      glad_glGetFragDataLocation = (PFNGLGETFRAGDATALOCATIONPROC)(*load)("glGetFragDataLocation");
      glad_glUniform1ui = (PFNGLUNIFORM1UIPROC)(*load)("glUniform1ui");
      glad_glUniform2ui = (PFNGLUNIFORM2UIPROC)(*load)("glUniform2ui");
      glad_glUniform3ui = (PFNGLUNIFORM3UIPROC)(*load)("glUniform3ui");
      glad_glUniform4ui = (PFNGLUNIFORM4UIPROC)(*load)("glUniform4ui");
      glad_glUniform1uiv = (PFNGLUNIFORM1UIVPROC)(*load)("glUniform1uiv");
      glad_glUniform2uiv = (PFNGLUNIFORM2UIVPROC)(*load)("glUniform2uiv");
      glad_glUniform3uiv = (PFNGLUNIFORM3UIVPROC)(*load)("glUniform3uiv");
      glad_glUniform4uiv = (PFNGLUNIFORM4UIVPROC)(*load)("glUniform4uiv");
      glad_glClearBufferiv = (PFNGLCLEARBUFFERIVPROC)(*load)("glClearBufferiv");
      glad_glClearBufferuiv = (PFNGLCLEARBUFFERUIVPROC)(*load)("glClearBufferuiv");
      glad_glClearBufferfv = (PFNGLCLEARBUFFERFVPROC)(*load)("glClearBufferfv");
      glad_glClearBufferfi = (PFNGLCLEARBUFFERFIPROC)(*load)("glClearBufferfi");
      glad_glGetStringi = (PFNGLGETSTRINGIPROC)(*load)("glGetStringi");
      glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC)(*load)("glCopyBufferSubData");
      glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)(*load)("glGetUniformIndices");
      glad_glGetActiveUniformsiv = (PFNGLGETACTIVEUNIFORMSIVPROC)(*load)("glGetActiveUniformsiv");
      glad_glGetUniformBlockIndex = (PFNGLGETUNIFORMBLOCKINDEXPROC)(*load)("glGetUniformBlockIndex")
      ;
      glad_glGetActiveUniformBlockiv =
           (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)(*load)("glGetActiveUniformBlockiv");
      glad_glGetActiveUniformBlockName =
           (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)(*load)("glGetActiveUniformBlockName");
      glad_glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC)(*load)("glUniformBlockBinding");
      glad_glDrawArraysInstanced = (PFNGLDRAWARRAYSINSTANCEDPROC)(*load)("glDrawArraysInstanced");
      glad_glDrawElementsInstanced =
           (PFNGLDRAWELEMENTSINSTANCEDPROC)(*load)("glDrawElementsInstanced");
      glad_glFenceSync = (PFNGLFENCESYNCPROC)(*load)("glFenceSync");
      glad_glIsSync = (PFNGLISSYNCPROC)(*load)("glIsSync");
      glad_glDeleteSync = (PFNGLDELETESYNCPROC)(*load)("glDeleteSync");
      glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)(*load)("glClientWaitSync");
      glad_glWaitSync = (PFNGLWAITSYNCPROC)(*load)("glWaitSync");
      glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)(*load)("glGetInteger64v");
      glad_glGetSynciv = (PFNGLGETSYNCIVPROC)(*load)("glGetSynciv");
      glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC)(*load)("glGetInteger64i_v");
      glad_glGetBufferParameteri64v =
           (PFNGLGETBUFFERPARAMETERI64VPROC)(*load)("glGetBufferParameteri64v");
      glad_glGenSamplers = (PFNGLGENSAMPLERSPROC)(*load)("glGenSamplers");
      glad_glDeleteSamplers = (PFNGLDELETESAMPLERSPROC)(*load)("glDeleteSamplers");
      glad_glIsSampler = (PFNGLISSAMPLERPROC)(*load)("glIsSampler");
      glad_glBindSampler = (PFNGLBINDSAMPLERPROC)(*load)("glBindSampler");
      glad_glSamplerParameteri = (PFNGLSAMPLERPARAMETERIPROC)(*load)("glSamplerParameteri");
      glad_glSamplerParameteriv = (PFNGLSAMPLERPARAMETERIVPROC)(*load)("glSamplerParameteriv");
      glad_glSamplerParameterf = (PFNGLSAMPLERPARAMETERFPROC)(*load)("glSamplerParameterf");
      glad_glSamplerParameterfv = (PFNGLSAMPLERPARAMETERFVPROC)(*load)("glSamplerParameterfv");
      glad_glGetSamplerParameteriv =
           (PFNGLGETSAMPLERPARAMETERIVPROC)(*load)("glGetSamplerParameteriv");
      glad_glGetSamplerParameterfv =
           (PFNGLGETSAMPLERPARAMETERFVPROC)(*load)("glGetSamplerParameterfv");
      glad_glVertexAttribDivisor = (PFNGLVERTEXATTRIBDIVISORPROC)(*load)("glVertexAttribDivisor");
      glad_glBindTransformFeedback =
           (PFNGLBINDTRANSFORMFEEDBACKPROC)(*load)("glBindTransformFeedback");
      glad_glDeleteTransformFeedbacks =
           (PFNGLDELETETRANSFORMFEEDBACKSPROC)(*load)("glDeleteTransformFeedbacks");
      glad_glGenTransformFeedbacks =
           (PFNGLGENTRANSFORMFEEDBACKSPROC)(*load)("glGenTransformFeedbacks");
      glad_glIsTransformFeedback = (PFNGLISTRANSFORMFEEDBACKPROC)(*load)("glIsTransformFeedback");
      glad_glPauseTransformFeedback =
           (PFNGLPAUSETRANSFORMFEEDBACKPROC)(*load)("glPauseTransformFeedback");
      glad_glResumeTransformFeedback =
           (PFNGLRESUMETRANSFORMFEEDBACKPROC)(*load)("glResumeTransformFeedback");
      glad_glGetProgramBinary = (PFNGLGETPROGRAMBINARYPROC)(*load)("glGetProgramBinary");
      glad_glProgramBinary = (PFNGLPROGRAMBINARYPROC)(*load)("glProgramBinary");
      glad_glProgramParameteri = (PFNGLPROGRAMPARAMETERIPROC)(*load)("glProgramParameteri");
      glad_glInvalidateFramebuffer =
           (PFNGLINVALIDATEFRAMEBUFFERPROC)(*load)("glInvalidateFramebuffer");
      glad_glInvalidateSubFramebuffer =
           (PFNGLINVALIDATESUBFRAMEBUFFERPROC)(*load)("glInvalidateSubFramebuffer");
      glad_glTexStorage2D = (PFNGLTEXSTORAGE2DPROC)(*load)("glTexStorage2D");
      glad_glTexStorage3D = (PFNGLTEXSTORAGE3DPROC)(*load)("glTexStorage3D");
      glad_glGetInternalformativ = (PFNGLGETINTERNALFORMATIVPROC)(*load)("glGetInternalformativ");
    }
    if (GLAD_GL_ES_VERSION_3_1 != 0) {
      glad_glDispatchCompute = (PFNGLDISPATCHCOMPUTEPROC)(*load)("glDispatchCompute");
      glad_glDispatchComputeIndirect =
           (PFNGLDISPATCHCOMPUTEINDIRECTPROC)(*load)("glDispatchComputeIndirect");
      glad_glDrawArraysIndirect = (PFNGLDRAWARRAYSINDIRECTPROC)(*load)("glDrawArraysIndirect");
      glad_glDrawElementsIndirect = (PFNGLDRAWELEMENTSINDIRECTPROC)(*load)("glDrawElementsIndirect")
      ;
      glad_glFramebufferParameteri =
           (PFNGLFRAMEBUFFERPARAMETERIPROC)(*load)("glFramebufferParameteri");
      glad_glGetFramebufferParameteriv =
           (PFNGLGETFRAMEBUFFERPARAMETERIVPROC)(*load)("glGetFramebufferParameteriv");
      glad_glGetProgramInterfaceiv =
           (PFNGLGETPROGRAMINTERFACEIVPROC)(*load)("glGetProgramInterfaceiv");
      glad_glGetProgramResourceIndex =
           (PFNGLGETPROGRAMRESOURCEINDEXPROC)(*load)("glGetProgramResourceIndex");
      glad_glGetProgramResourceName =
           (PFNGLGETPROGRAMRESOURCENAMEPROC)(*load)("glGetProgramResourceName");
      glad_glGetProgramResourceiv = (PFNGLGETPROGRAMRESOURCEIVPROC)(*load)("glGetProgramResourceiv")
      ;
      glad_glGetProgramResourceLocation =
           (PFNGLGETPROGRAMRESOURCELOCATIONPROC)(*load)("glGetProgramResourceLocation");
      glad_glUseProgramStages = (PFNGLUSEPROGRAMSTAGESPROC)(*load)("glUseProgramStages");
      glad_glActiveShaderProgram = (PFNGLACTIVESHADERPROGRAMPROC)(*load)("glActiveShaderProgram");
      glad_glCreateShaderProgramv = (PFNGLCREATESHADERPROGRAMVPROC)(*load)("glCreateShaderProgramv")
      ;
      glad_glBindProgramPipeline = (PFNGLBINDPROGRAMPIPELINEPROC)(*load)("glBindProgramPipeline");
      glad_glDeleteProgramPipelines =
           (PFNGLDELETEPROGRAMPIPELINESPROC)(*load)("glDeleteProgramPipelines");
      glad_glGenProgramPipelines = (PFNGLGENPROGRAMPIPELINESPROC)(*load)("glGenProgramPipelines");
      glad_glIsProgramPipeline = (PFNGLISPROGRAMPIPELINEPROC)(*load)("glIsProgramPipeline");
      glad_glGetProgramPipelineiv = (PFNGLGETPROGRAMPIPELINEIVPROC)(*load)("glGetProgramPipelineiv")
      ;
      glad_glProgramUniform1i = (PFNGLPROGRAMUNIFORM1IPROC)(*load)("glProgramUniform1i");
      glad_glProgramUniform2i = (PFNGLPROGRAMUNIFORM2IPROC)(*load)("glProgramUniform2i");
      glad_glProgramUniform3i = (PFNGLPROGRAMUNIFORM3IPROC)(*load)("glProgramUniform3i");
      glad_glProgramUniform4i = (PFNGLPROGRAMUNIFORM4IPROC)(*load)("glProgramUniform4i");
      glad_glProgramUniform1ui = (PFNGLPROGRAMUNIFORM1UIPROC)(*load)("glProgramUniform1ui");
      glad_glProgramUniform2ui = (PFNGLPROGRAMUNIFORM2UIPROC)(*load)("glProgramUniform2ui");
      glad_glProgramUniform3ui = (PFNGLPROGRAMUNIFORM3UIPROC)(*load)("glProgramUniform3ui");
      glad_glProgramUniform4ui = (PFNGLPROGRAMUNIFORM4UIPROC)(*load)("glProgramUniform4ui");
      glad_glProgramUniform1f = (PFNGLPROGRAMUNIFORM1FPROC)(*load)("glProgramUniform1f");
      glad_glProgramUniform2f = (PFNGLPROGRAMUNIFORM2FPROC)(*load)("glProgramUniform2f");
      glad_glProgramUniform3f = (PFNGLPROGRAMUNIFORM3FPROC)(*load)("glProgramUniform3f");
      glad_glProgramUniform4f = (PFNGLPROGRAMUNIFORM4FPROC)(*load)("glProgramUniform4f");
      glad_glProgramUniform1iv = (PFNGLPROGRAMUNIFORM1IVPROC)(*load)("glProgramUniform1iv");
      glad_glProgramUniform2iv = (PFNGLPROGRAMUNIFORM2IVPROC)(*load)("glProgramUniform2iv");
      glad_glProgramUniform3iv = (PFNGLPROGRAMUNIFORM3IVPROC)(*load)("glProgramUniform3iv");
      glad_glProgramUniform4iv = (PFNGLPROGRAMUNIFORM4IVPROC)(*load)("glProgramUniform4iv");
      glad_glProgramUniform1uiv = (PFNGLPROGRAMUNIFORM1UIVPROC)(*load)("glProgramUniform1uiv");
      glad_glProgramUniform2uiv = (PFNGLPROGRAMUNIFORM2UIVPROC)(*load)("glProgramUniform2uiv");
      glad_glProgramUniform3uiv = (PFNGLPROGRAMUNIFORM3UIVPROC)(*load)("glProgramUniform3uiv");
      glad_glProgramUniform4uiv = (PFNGLPROGRAMUNIFORM4UIVPROC)(*load)("glProgramUniform4uiv");
      glad_glProgramUniform1fv = (PFNGLPROGRAMUNIFORM1FVPROC)(*load)("glProgramUniform1fv");
      glad_glProgramUniform2fv = (PFNGLPROGRAMUNIFORM2FVPROC)(*load)("glProgramUniform2fv");
      glad_glProgramUniform3fv = (PFNGLPROGRAMUNIFORM3FVPROC)(*load)("glProgramUniform3fv");
      glad_glProgramUniform4fv = (PFNGLPROGRAMUNIFORM4FVPROC)(*load)("glProgramUniform4fv");
      glad_glProgramUniformMatrix2fv =
           (PFNGLPROGRAMUNIFORMMATRIX2FVPROC)(*load)("glProgramUniformMatrix2fv");
      glad_glProgramUniformMatrix3fv =
           (PFNGLPROGRAMUNIFORMMATRIX3FVPROC)(*load)("glProgramUniformMatrix3fv");
      glad_glProgramUniformMatrix4fv =
           (PFNGLPROGRAMUNIFORMMATRIX4FVPROC)(*load)("glProgramUniformMatrix4fv");
      glad_glProgramUniformMatrix2x3fv =
           (PFNGLPROGRAMUNIFORMMATRIX2X3FVPROC)(*load)("glProgramUniformMatrix2x3fv");
      glad_glProgramUniformMatrix3x2fv =
           (PFNGLPROGRAMUNIFORMMATRIX3X2FVPROC)(*load)("glProgramUniformMatrix3x2fv");
      glad_glProgramUniformMatrix2x4fv =
           (PFNGLPROGRAMUNIFORMMATRIX2X4FVPROC)(*load)("glProgramUniformMatrix2x4fv");
      glad_glProgramUniformMatrix4x2fv =
           (PFNGLPROGRAMUNIFORMMATRIX4X2FVPROC)(*load)("glProgramUniformMatrix4x2fv");
      glad_glProgramUniformMatrix3x4fv =
           (PFNGLPROGRAMUNIFORMMATRIX3X4FVPROC)(*load)("glProgramUniformMatrix3x4fv");
      glad_glProgramUniformMatrix4x3fv =
           (PFNGLPROGRAMUNIFORMMATRIX4X3FVPROC)(*load)("glProgramUniformMatrix4x3fv");
      glad_glValidateProgramPipeline =
           (PFNGLVALIDATEPROGRAMPIPELINEPROC)(*load)("glValidateProgramPipeline");
      glad_glGetProgramPipelineInfoLog =
           (PFNGLGETPROGRAMPIPELINEINFOLOGPROC)(*load)("glGetProgramPipelineInfoLog");
      glad_glBindImageTexture = (PFNGLBINDIMAGETEXTUREPROC)(*load)("glBindImageTexture");
      glad_glGetBooleani_v = (PFNGLGETBOOLEANI_VPROC)(*load)("glGetBooleani_v");
      glad_glMemoryBarrier = (PFNGLMEMORYBARRIERPROC)(*load)("glMemoryBarrier");
      glad_glMemoryBarrierByRegion =
           (PFNGLMEMORYBARRIERBYREGIONPROC)(*load)("glMemoryBarrierByRegion");
      glad_glTexStorage2DMultisample =
           (PFNGLTEXSTORAGE2DMULTISAMPLEPROC)(*load)("glTexStorage2DMultisample");
      glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*load)("glGetMultisamplefv");
      glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*load)("glSampleMaski");
      glad_glGetTexLevelParameteriv =
           (PFNGLGETTEXLEVELPARAMETERIVPROC)(*load)("glGetTexLevelParameteriv");
      glad_glGetTexLevelParameterfv =
           (PFNGLGETTEXLEVELPARAMETERFVPROC)(*load)("glGetTexLevelParameterfv");
      glad_glBindVertexBuffer = (PFNGLBINDVERTEXBUFFERPROC)(*load)("glBindVertexBuffer");
      glad_glVertexAttribFormat = (PFNGLVERTEXATTRIBFORMATPROC)(*load)("glVertexAttribFormat");
      glad_glVertexAttribIFormat = (PFNGLVERTEXATTRIBIFORMATPROC)(*load)("glVertexAttribIFormat");
      glad_glVertexAttribBinding = (PFNGLVERTEXATTRIBBINDINGPROC)(*load)("glVertexAttribBinding");
      glad_glVertexBindingDivisor = (PFNGLVERTEXBINDINGDIVISORPROC)(*load)("glVertexBindingDivisor")
      ;
    }
    get_exts();
    GLAD_GL_EXT_post_depth_coverage = has_ext("GL_EXT_post_depth_coverage");
    GLAD_GL_OVR_multiview = has_ext("GL_OVR_multiview");
    GLAD_GL_NV_viewport_array2 = has_ext("GL_NV_viewport_array2");
    GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
    GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
    GLAD_GL_NV_conditional_render = has_ext("GL_NV_conditional_render");
    GLAD_GL_EXT_separate_shader_objects = has_ext("GL_EXT_separate_shader_objects");
    GLAD_GL_AMD_performance_monitor = has_ext("GL_AMD_performance_monitor");
    GLAD_GL_EXT_shader_integer_mix = has_ext("GL_EXT_shader_integer_mix");
    GLAD_GL_KHR_robustness = has_ext("GL_KHR_robustness");
    GLAD_GL_NV_fragment_coverage_to_color = has_ext("GL_NV_fragment_coverage_to_color");
    GLAD_GL_NV_fence = has_ext("GL_NV_fence");
    GLAD_GL_NV_sample_mask_override_coverage = has_ext("GL_NV_sample_mask_override_coverage");
    GLAD_GL_NV_path_rendering_shared_edge = has_ext("GL_NV_path_rendering_shared_edge");
    GLAD_GL_NV_blend_equation_advanced = has_ext("GL_NV_blend_equation_advanced");
    GLAD_GL_KHR_robust_buffer_access_behavior = has_ext("GL_KHR_robust_buffer_access_behavior");
    GLAD_GL_NV_geometry_shader_passthrough = has_ext("GL_NV_geometry_shader_passthrough");
    GLAD_GL_NV_bindless_texture = has_ext("GL_NV_bindless_texture");
    GLAD_GL_KHR_debug = has_ext("GL_KHR_debug");
    GLAD_GL_KHR_texture_compression_astc_hdr = has_ext("GL_KHR_texture_compression_astc_hdr");
    GLAD_GL_KHR_blend_equation_advanced = has_ext("GL_KHR_blend_equation_advanced");
    GLAD_GL_KHR_no_error = has_ext("GL_KHR_no_error");
    GLAD_GL_EXT_texture_filter_minmax = has_ext("GL_EXT_texture_filter_minmax");
    GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
    GLAD_GL_NV_blend_equation_advanced_coherent = has_ext("GL_NV_blend_equation_advanced_coherent");
    GLAD_GL_OVR_multiview2 = has_ext("GL_OVR_multiview2");
    GLAD_GL_NV_framebuffer_mixed_samples = has_ext("GL_NV_framebuffer_mixed_samples");
    GLAD_GL_EXT_raster_multisample = has_ext("GL_EXT_raster_multisample");
    GLAD_GL_EXT_debug_marker = has_ext("GL_EXT_debug_marker");
    GLAD_GL_EXT_texture_compression_s3tc = has_ext("GL_EXT_texture_compression_s3tc");
    GLAD_GL_INTEL_performance_query = has_ext("GL_INTEL_performance_query");
    GLAD_GL_EXT_texture_sRGB_decode = has_ext("GL_EXT_texture_sRGB_decode");
    GLAD_GL_EXT_debug_label = has_ext("GL_EXT_debug_label");
    GLAD_GL_NV_internalformat_sample_query = has_ext("GL_NV_internalformat_sample_query");
    GLAD_GL_EXT_draw_instanced = has_ext("GL_EXT_draw_instanced");
    GLAD_GL_KHR_blend_equation_advanced_coherent =
         has_ext("GL_KHR_blend_equation_advanced_coherent");
    GLAD_GL_NV_fill_rectangle = has_ext("GL_NV_fill_rectangle");
    GLAD_GL_KHR_texture_compression_astc_ldr = has_ext("GL_KHR_texture_compression_astc_ldr");
    GLAD_GL_NV_conservative_raster = has_ext("GL_NV_conservative_raster");
    GLAD_GL_NV_fragment_shader_interlock = has_ext("GL_NV_fragment_shader_interlock");
    GLAD_GL_NV_path_rendering = has_ext("GL_NV_path_rendering");
    GLAD_GL_APPLE_rgb_422 = has_ext("GL_APPLE_rgb_422");
    GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
    GLAD_GL_NV_sample_locations = has_ext("GL_NV_sample_locations");
    GLAD_GL_KHR_context_flush_control = has_ext("GL_KHR_context_flush_control");
    GLAD_GL_NV_non_square_matrices = has_ext("GL_NV_non_square_matrices");
    GLAD_GL_OES_packed_depth_stencil = has_ext("GL_OES_packed_depth_stencil");
    GLAD_GL_QCOM_perfmon_global_mode = has_ext("GL_QCOM_perfmon_global_mode");
    GLAD_GL_EXT_sparse_texture = has_ext("GL_EXT_sparse_texture");
    GLAD_GL_NV_draw_instanced = has_ext("GL_NV_draw_instanced");
    GLAD_GL_OES_texture_half_float_linear = has_ext("GL_OES_texture_half_float_linear");
    GLAD_GL_KHR_blend_equation_advanced_coherent =
         has_ext("GL_KHR_blend_equation_advanced_coherent");
    GLAD_GL_NV_fragment_coverage_to_color = has_ext("GL_NV_fragment_coverage_to_color");
    GLAD_GL_NV_fence = has_ext("GL_NV_fence");
    GLAD_GL_NV_texture_border_clamp = has_ext("GL_NV_texture_border_clamp");
    GLAD_GL_IMG_texture_compression_pvrtc = has_ext("GL_IMG_texture_compression_pvrtc");
    GLAD_GL_NV_sRGB_formats = has_ext("GL_NV_sRGB_formats");
    GLAD_GL_EXT_texture_compression_s3tc = has_ext("GL_EXT_texture_compression_s3tc");
    GLAD_GL_NV_sample_locations = has_ext("GL_NV_sample_locations");
    GLAD_GL_EXT_base_instance = has_ext("GL_EXT_base_instance");
    GLAD_GL_EXT_instanced_arrays = has_ext("GL_EXT_instanced_arrays");
    GLAD_GL_QCOM_writeonly_rendering = has_ext("GL_QCOM_writeonly_rendering");
    GLAD_GL_DMP_program_binary = has_ext("GL_DMP_program_binary");
    GLAD_GL_EXT_draw_buffers_indexed = has_ext("GL_EXT_draw_buffers_indexed");
    GLAD_GL_NV_read_depth_stencil = has_ext("GL_NV_read_depth_stencil");
    GLAD_GL_OVR_multiview = has_ext("GL_OVR_multiview");
    GLAD_GL_ANGLE_translated_shader_source = has_ext("GL_ANGLE_translated_shader_source");
    GLAD_GL_NV_fill_rectangle = has_ext("GL_NV_fill_rectangle");
    GLAD_GL_NV_coverage_sample = has_ext("GL_NV_coverage_sample");
    GLAD_GL_OES_texture_cube_map_array = has_ext("GL_OES_texture_cube_map_array");
    GLAD_GL_ANGLE_framebuffer_multisample = has_ext("GL_ANGLE_framebuffer_multisample");
    GLAD_GL_OES_vertex_array_object = has_ext("GL_OES_vertex_array_object");
    GLAD_GL_QCOM_tiled_rendering = has_ext("GL_QCOM_tiled_rendering");
    GLAD_GL_NV_sample_mask_override_coverage = has_ext("GL_NV_sample_mask_override_coverage");
    GLAD_GL_AMD_program_binary_Z400 = has_ext("GL_AMD_program_binary_Z400");
    GLAD_GL_APPLE_color_buffer_packed_float = has_ext("GL_APPLE_color_buffer_packed_float");
    GLAD_GL_EXT_robustness = has_ext("GL_EXT_robustness");
    GLAD_GL_OES_fbo_render_mipmap = has_ext("GL_OES_fbo_render_mipmap");
    GLAD_GL_NV_viewport_array2 = has_ext("GL_NV_viewport_array2");
    GLAD_GL_KHR_robustness = has_ext("GL_KHR_robustness");
    GLAD_GL_OES_compressed_ETC1_RGB8_sub_texture =
         has_ext("GL_OES_compressed_ETC1_RGB8_sub_texture");
    GLAD_GL_ANGLE_texture_usage = has_ext("GL_ANGLE_texture_usage");
    GLAD_GL_EXT_gpu_shader5 = has_ext("GL_EXT_gpu_shader5");
    GLAD_GL_OES_shader_io_blocks = has_ext("GL_OES_shader_io_blocks");
    GLAD_GL_FJ_shader_binary_GCCSO = has_ext("GL_FJ_shader_binary_GCCSO");
    GLAD_GL_EXT_disjoint_timer_query = has_ext("GL_EXT_disjoint_timer_query");
    GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
    GLAD_GL_EXT_shader_texture_lod = has_ext("GL_EXT_shader_texture_lod");
    GLAD_GL_NV_read_buffer_front = has_ext("GL_NV_read_buffer_front");
    GLAD_GL_OES_texture_float = has_ext("GL_OES_texture_float");
    GLAD_GL_NV_conservative_raster = has_ext("GL_NV_conservative_raster");
    GLAD_GL_NV_path_rendering_shared_edge = has_ext("GL_NV_path_rendering_shared_edge");
    GLAD_GL_NV_fbo_color_attachments = has_ext("GL_NV_fbo_color_attachments");
    GLAD_GL_EXT_primitive_bounding_box = has_ext("GL_EXT_primitive_bounding_box");
    GLAD_GL_IMG_read_format = has_ext("GL_IMG_read_format");
    GLAD_GL_EXT_shader_integer_mix = has_ext("GL_EXT_shader_integer_mix");
    GLAD_GL_ANDROID_extension_pack_es31a = has_ext("GL_ANDROID_extension_pack_es31a");
    GLAD_GL_NV_framebuffer_mixed_samples = has_ext("GL_NV_framebuffer_mixed_samples");
    GLAD_GL_NV_texture_compression_s3tc_update = has_ext("GL_NV_texture_compression_s3tc_update");
    GLAD_GL_OES_texture_float_linear = has_ext("GL_OES_texture_float_linear");
    GLAD_GL_OES_fragment_precision_high = has_ext("GL_OES_fragment_precision_high");
    GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
    GLAD_GL_EXT_raster_multisample = has_ext("GL_EXT_raster_multisample");
    GLAD_GL_EXT_texture_compression_dxt1 = has_ext("GL_EXT_texture_compression_dxt1");
    GLAD_GL_EXT_texture_sRGB_RG8 = has_ext("GL_EXT_texture_sRGB_RG8");
    GLAD_GL_APPLE_clip_distance = has_ext("GL_APPLE_clip_distance");
    GLAD_GL_QCOM_driver_control = has_ext("GL_QCOM_driver_control");
    GLAD_GL_ANGLE_depth_texture = has_ext("GL_ANGLE_depth_texture");
    GLAD_GL_KHR_robust_buffer_access_behavior = has_ext("GL_KHR_robust_buffer_access_behavior");
    GLAD_GL_EXT_render_snorm = has_ext("GL_EXT_render_snorm");
    GLAD_GL_KHR_texture_compression_astc_ldr = has_ext("GL_KHR_texture_compression_astc_ldr");
    GLAD_GL_EXT_debug_marker = has_ext("GL_EXT_debug_marker");
    GLAD_GL_OES_geometry_shader = has_ext("GL_OES_geometry_shader");
    GLAD_GL_OES_tessellation_shader = has_ext("GL_OES_tessellation_shader");
    GLAD_GL_OES_texture_view = has_ext("GL_OES_texture_view");
    GLAD_GL_EXT_multisampled_render_to_texture = has_ext("GL_EXT_multisampled_render_to_texture");
    GLAD_GL_EXT_buffer_storage = has_ext("GL_EXT_buffer_storage");
    GLAD_GL_OES_texture_buffer = has_ext("GL_OES_texture_buffer");
    GLAD_GL_NV_blend_equation_advanced_coherent = has_ext("GL_NV_blend_equation_advanced_coherent");
    GLAD_GL_EXT_post_depth_coverage = has_ext("GL_EXT_post_depth_coverage");
    GLAD_GL_NV_geometry_shader_passthrough = has_ext("GL_NV_geometry_shader_passthrough");
    GLAD_GL_EXT_tessellation_point_size = has_ext("GL_EXT_tessellation_point_size");
    GLAD_GL_EXT_color_buffer_half_float = has_ext("GL_EXT_color_buffer_half_float");
    GLAD_GL_OES_get_program_binary = has_ext("GL_OES_get_program_binary");
    GLAD_GL_OES_geometry_point_size = has_ext("GL_OES_geometry_point_size");
    GLAD_GL_APPLE_framebuffer_multisample = has_ext("GL_APPLE_framebuffer_multisample");
    GLAD_GL_OES_stencil4 = has_ext("GL_OES_stencil4");
    GLAD_GL_NV_copy_buffer = has_ext("GL_NV_copy_buffer");
    GLAD_GL_OES_texture_half_float = has_ext("GL_OES_texture_half_float");
    GLAD_GL_EXT_texture_view = has_ext("GL_EXT_texture_view");
    GLAD_GL_OES_vertex_half_float = has_ext("GL_OES_vertex_half_float");
    GLAD_GL_NV_framebuffer_blit = has_ext("GL_NV_framebuffer_blit");
    GLAD_GL_OES_stencil1 = has_ext("GL_OES_stencil1");
    GLAD_GL_QCOM_alpha_test = has_ext("GL_QCOM_alpha_test");
    GLAD_GL_EXT_shader_implicit_conversions = has_ext("GL_EXT_shader_implicit_conversions");
    GLAD_GL_INTEL_performance_query = has_ext("GL_INTEL_performance_query");
    GLAD_GL_KHR_debug = has_ext("GL_KHR_debug");
    GLAD_GL_EXT_sRGB = has_ext("GL_EXT_sRGB");
    GLAD_GL_OES_texture_border_clamp = has_ext("GL_OES_texture_border_clamp");
    GLAD_GL_ANGLE_pack_reverse_row_order = has_ext("GL_ANGLE_pack_reverse_row_order");
    GLAD_GL_EXT_occlusion_query_boolean = has_ext("GL_EXT_occlusion_query_boolean");
    GLAD_GL_NV_bindless_texture = has_ext("GL_NV_bindless_texture");
    GLAD_GL_EXT_multi_draw_indirect = has_ext("GL_EXT_multi_draw_indirect");
    GLAD_GL_OES_tessellation_point_size = has_ext("GL_OES_tessellation_point_size");
    GLAD_GL_KHR_no_error = has_ext("GL_KHR_no_error");
    GLAD_GL_OES_depth_texture = has_ext("GL_OES_depth_texture");
    GLAD_GL_QCOM_binning_control = has_ext("GL_QCOM_binning_control");
    GLAD_GL_KHR_texture_compression_astc_hdr = has_ext("GL_KHR_texture_compression_astc_hdr");
    GLAD_GL_KHR_blend_equation_advanced = has_ext("GL_KHR_blend_equation_advanced");
    GLAD_GL_OES_surfaceless_context = has_ext("GL_OES_surfaceless_context");
    GLAD_GL_APPLE_sync = has_ext("GL_APPLE_sync");
    GLAD_GL_IMG_program_binary = has_ext("GL_IMG_program_binary");
    GLAD_GL_EXT_geometry_point_size = has_ext("GL_EXT_geometry_point_size");
    GLAD_GL_EXT_shader_framebuffer_fetch = has_ext("GL_EXT_shader_framebuffer_fetch");
    GLAD_GL_ANGLE_program_binary = has_ext("GL_ANGLE_program_binary");
    GLAD_GL_EXT_unpack_subimage = has_ext("GL_EXT_unpack_subimage");
    GLAD_GL_ANGLE_texture_compression_dxt3 = has_ext("GL_ANGLE_texture_compression_dxt3");
    GLAD_GL_ANGLE_texture_compression_dxt5 = has_ext("GL_ANGLE_texture_compression_dxt5");
    GLAD_GL_OES_texture_npot = has_ext("GL_OES_texture_npot");
    GLAD_GL_EXT_read_format_bgra = has_ext("GL_EXT_read_format_bgra");
    GLAD_GL_OES_compressed_ETC1_RGB8_texture = has_ext("GL_OES_compressed_ETC1_RGB8_texture");
    GLAD_GL_OES_copy_image = has_ext("GL_OES_copy_image");
    GLAD_GL_EXT_pvrtc_sRGB = has_ext("GL_EXT_pvrtc_sRGB");
    GLAD_GL_QCOM_extended_get2 = has_ext("GL_QCOM_extended_get2");
    GLAD_GL_EXT_shader_pixel_local_storage = has_ext("GL_EXT_shader_pixel_local_storage");
    GLAD_GL_NV_shadow_samplers_cube = has_ext("GL_NV_shadow_samplers_cube");
    GLAD_GL_OES_texture_compression_astc = has_ext("GL_OES_texture_compression_astc");
    GLAD_GL_OES_depth32 = has_ext("GL_OES_depth32");
    GLAD_GL_APPLE_texture_max_level = has_ext("GL_APPLE_texture_max_level");
    GLAD_GL_OES_shader_multisample_interpolation =
         has_ext("GL_OES_shader_multisample_interpolation");
    GLAD_GL_EXT_shadow_samplers = has_ext("GL_EXT_shadow_samplers");
    GLAD_GL_IMG_shader_binary = has_ext("GL_IMG_shader_binary");
    GLAD_GL_EXT_draw_elements_base_vertex = has_ext("GL_EXT_draw_elements_base_vertex");
    GLAD_GL_NV_fragment_shader_interlock = has_ext("GL_NV_fragment_shader_interlock");
    GLAD_GL_EXT_separate_shader_objects = has_ext("GL_EXT_separate_shader_objects");
    GLAD_GL_EXT_shader_io_blocks = has_ext("GL_EXT_shader_io_blocks");
    GLAD_GL_NV_framebuffer_multisample = has_ext("GL_NV_framebuffer_multisample");
    GLAD_GL_EXT_texture_filter_minmax = has_ext("GL_EXT_texture_filter_minmax");
    GLAD_GL_ARM_shader_framebuffer_fetch = has_ext("GL_ARM_shader_framebuffer_fetch");
    GLAD_GL_NV_path_rendering = has_ext("GL_NV_path_rendering");
    GLAD_GL_OES_texture_storage_multisample_2d_array =
         has_ext("GL_OES_texture_storage_multisample_2d_array");
    GLAD_GL_OES_draw_buffers_indexed = has_ext("GL_OES_draw_buffers_indexed");
    GLAD_GL_OES_EGL_image = has_ext("GL_OES_EGL_image");
    GLAD_GL_NV_draw_buffers = has_ext("GL_NV_draw_buffers");
    GLAD_GL_OES_vertex_type_10_10_10_2 = has_ext("GL_OES_vertex_type_10_10_10_2");
    GLAD_GL_APPLE_rgb_422 = has_ext("GL_APPLE_rgb_422");
    GLAD_GL_DMP_shader_binary = has_ext("GL_DMP_shader_binary");
    GLAD_GL_NV_texture_npot_2D_mipmap = has_ext("GL_NV_texture_npot_2D_mipmap");
    GLAD_GL_OES_sample_variables = has_ext("GL_OES_sample_variables");
    GLAD_GL_NV_explicit_attrib_location = has_ext("GL_NV_explicit_attrib_location");
    GLAD_GL_NV_blend_equation_advanced = has_ext("GL_NV_blend_equation_advanced");
    GLAD_GL_EXT_draw_buffers = has_ext("GL_EXT_draw_buffers");
    GLAD_GL_EXT_debug_label = has_ext("GL_EXT_debug_label");
    GLAD_GL_NV_read_stencil = has_ext("GL_NV_read_stencil");
    GLAD_GL_NV_conditional_render = has_ext("GL_NV_conditional_render");
    GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
    GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
    GLAD_GL_NV_internalformat_sample_query = has_ext("GL_NV_internalformat_sample_query");
    GLAD_GL_OES_depth24 = has_ext("GL_OES_depth24");
    GLAD_GL_NV_instanced_arrays = has_ext("GL_NV_instanced_arrays");
    GLAD_GL_EXT_texture_storage = has_ext("GL_EXT_texture_storage");
    GLAD_GL_OES_gpu_shader5 = has_ext("GL_OES_gpu_shader5");
    GLAD_GL_OES_required_internalformat = has_ext("GL_OES_required_internalformat");
    GLAD_GL_EXT_sRGB_write_control = has_ext("GL_EXT_sRGB_write_control");
    GLAD_GL_EXT_copy_image = has_ext("GL_EXT_copy_image");
    GLAD_GL_AMD_compressed_3DC_texture = has_ext("GL_AMD_compressed_3DC_texture");
    GLAD_GL_OES_element_index_uint = has_ext("GL_OES_element_index_uint");
    GLAD_GL_OES_sample_shading = has_ext("GL_OES_sample_shading");
    GLAD_GL_IMG_texture_compression_pvrtc2 = has_ext("GL_IMG_texture_compression_pvrtc2");
    GLAD_GL_NV_viewport_array = has_ext("GL_NV_viewport_array");
    GLAD_GL_OES_rgb8_rgba8 = has_ext("GL_OES_rgb8_rgba8");
    GLAD_GL_EXT_map_buffer_range = has_ext("GL_EXT_map_buffer_range");
    GLAD_GL_OES_mapbuffer = has_ext("GL_OES_mapbuffer");
    GLAD_GL_EXT_float_blend = has_ext("GL_EXT_float_blend");
    GLAD_GL_NV_polygon_mode = has_ext("GL_NV_polygon_mode");
    GLAD_GL_ARM_shader_framebuffer_fetch_depth_stencil =
         has_ext("GL_ARM_shader_framebuffer_fetch_depth_stencil");
    GLAD_GL_NV_image_formats = has_ext("GL_NV_image_formats");
    GLAD_GL_OES_EGL_image_external = has_ext("GL_OES_EGL_image_external");
    GLAD_GL_APPLE_texture_format_BGRA8888 = has_ext("GL_APPLE_texture_format_BGRA8888");
    GLAD_GL_AMD_performance_monitor = has_ext("GL_AMD_performance_monitor");
    GLAD_GL_VIV_shader_binary = has_ext("GL_VIV_shader_binary");
    GLAD_GL_NV_shadow_samplers_array = has_ext("GL_NV_shadow_samplers_array");
    GLAD_GL_OVR_multiview2 = has_ext("GL_OVR_multiview2");
    GLAD_GL_IMG_multisampled_render_to_texture = has_ext("GL_IMG_multisampled_render_to_texture");
    GLAD_GL_NV_depth_nonlinear = has_ext("GL_NV_depth_nonlinear");
    GLAD_GL_OES_draw_elements_base_vertex = has_ext("GL_OES_draw_elements_base_vertex");
    GLAD_GL_NV_shader_noperspective_interpolation =
         has_ext("GL_NV_shader_noperspective_interpolation");
    GLAD_GL_EXT_texture_format_BGRA8888 = has_ext("GL_EXT_texture_format_BGRA8888");
    GLAD_GL_EXT_YUV_target = has_ext("GL_EXT_YUV_target");
    GLAD_GL_APPLE_copy_texture_levels = has_ext("GL_APPLE_copy_texture_levels");
    GLAD_GL_ARM_mali_shader_binary = has_ext("GL_ARM_mali_shader_binary");
    GLAD_GL_EXT_multiview_draw_buffers = has_ext("GL_EXT_multiview_draw_buffers");
    GLAD_GL_OES_texture_stencil8 = has_ext("GL_OES_texture_stencil8");
    GLAD_GL_QCOM_extended_get = has_ext("GL_QCOM_extended_get");
    GLAD_GL_EXT_geometry_shader = has_ext("GL_EXT_geometry_shader");
    GLAD_GL_EXT_texture_norm16 = has_ext("GL_EXT_texture_norm16");
    GLAD_GL_EXT_texture_rg = has_ext("GL_EXT_texture_rg");
    GLAD_GL_OES_standard_derivatives = has_ext("GL_OES_standard_derivatives");
    GLAD_GL_EXT_texture_border_clamp = has_ext("GL_EXT_texture_border_clamp");
    GLAD_GL_OES_shader_image_atomic = has_ext("GL_OES_shader_image_atomic");
    GLAD_GL_ANGLE_framebuffer_blit = has_ext("GL_ANGLE_framebuffer_blit");
    GLAD_GL_EXT_draw_instanced = has_ext("GL_EXT_draw_instanced");
    GLAD_GL_OES_texture_3D = has_ext("GL_OES_texture_3D");
    GLAD_GL_ARM_rgba8 = has_ext("GL_ARM_rgba8");
    GLAD_GL_EXT_tessellation_shader = has_ext("GL_EXT_tessellation_shader");
    GLAD_GL_OES_primitive_bounding_box = has_ext("GL_OES_primitive_bounding_box");
    GLAD_GL_EXT_texture_sRGB_R8 = has_ext("GL_EXT_texture_sRGB_R8");
    GLAD_GL_NV_read_buffer = has_ext("GL_NV_read_buffer");
    GLAD_GL_NV_generate_mipmap_sRGB = has_ext("GL_NV_generate_mipmap_sRGB");
    GLAD_GL_EXT_texture_cube_map_array = has_ext("GL_EXT_texture_cube_map_array");
    GLAD_GL_OES_EGL_image_external_essl3 = has_ext("GL_OES_EGL_image_external_essl3");
    GLAD_GL_KHR_context_flush_control = has_ext("GL_KHR_context_flush_control");
    GLAD_GL_EXT_texture_type_2_10_10_10_REV = has_ext("GL_EXT_texture_type_2_10_10_10_REV");
    GLAD_GL_ANGLE_instanced_arrays = has_ext("GL_ANGLE_instanced_arrays");
    GLAD_GL_EXT_discard_framebuffer = has_ext("GL_EXT_discard_framebuffer");
    GLAD_GL_EXT_texture_sRGB_decode = has_ext("GL_EXT_texture_sRGB_decode");
    GLAD_GL_NV_read_depth = has_ext("GL_NV_read_depth");
    GLAD_GL_ARM_mali_program_binary = has_ext("GL_ARM_mali_program_binary");
    GLAD_GL_AMD_compressed_ATC_texture = has_ext("GL_AMD_compressed_ATC_texture");
    GLAD_GL_APPLE_texture_packed_float = has_ext("GL_APPLE_texture_packed_float");
    GLAD_GL_EXT_texture_buffer = has_ext("GL_EXT_texture_buffer");
    GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
    GLAD_GL_AMD_compressed_3DC_texture = has_ext("GL_AMD_compressed_3DC_texture");
    GLAD_GL_EXT_texture_compression_dxt1 = has_ext("GL_EXT_texture_compression_dxt1");
    GLAD_GL_OES_element_index_uint = has_ext("GL_OES_element_index_uint");
    GLAD_GL_NV_fence = has_ext("GL_NV_fence");
    GLAD_GL_EXT_map_buffer_range = has_ext("GL_EXT_map_buffer_range");
    GLAD_GL_EXT_read_format_bgra = has_ext("GL_EXT_read_format_bgra");
    GLAD_GL_OES_compressed_ETC1_RGB8_texture = has_ext("GL_OES_compressed_ETC1_RGB8_texture");
    GLAD_GL_QCOM_extended_get2 = has_ext("GL_QCOM_extended_get2");
    GLAD_GL_OES_EGL_image_external = has_ext("GL_OES_EGL_image_external");
    GLAD_GL_OES_required_internalformat = has_ext("GL_OES_required_internalformat");
    GLAD_GL_APPLE_texture_max_level = has_ext("GL_APPLE_texture_max_level");
    GLAD_GL_EXT_multisampled_render_to_texture = has_ext("GL_EXT_multisampled_render_to_texture");
    GLAD_GL_QCOM_writeonly_rendering = has_ext("GL_QCOM_writeonly_rendering");
    GLAD_GL_OES_packed_depth_stencil = has_ext("GL_OES_packed_depth_stencil");
    GLAD_GL_APPLE_texture_format_BGRA8888 = has_ext("GL_APPLE_texture_format_BGRA8888");
    GLAD_GL_EXT_discard_framebuffer = has_ext("GL_EXT_discard_framebuffer");
    GLAD_GL_QCOM_perfmon_global_mode = has_ext("GL_QCOM_perfmon_global_mode");
    GLAD_GL_OES_mapbuffer = has_ext("GL_OES_mapbuffer");
    GLAD_GL_IMG_multisampled_render_to_texture = has_ext("GL_IMG_multisampled_render_to_texture");
    GLAD_GL_OES_depth32 = has_ext("GL_OES_depth32");
    GLAD_GL_APPLE_framebuffer_multisample = has_ext("GL_APPLE_framebuffer_multisample");
    GLAD_GL_APPLE_copy_texture_levels = has_ext("GL_APPLE_copy_texture_levels");
    GLAD_GL_EXT_texture_format_BGRA8888 = has_ext("GL_EXT_texture_format_BGRA8888");
    GLAD_GL_OES_EGL_image = has_ext("GL_OES_EGL_image");
    GLAD_GL_QCOM_extended_get = has_ext("GL_QCOM_extended_get");
    GLAD_GL_QCOM_tiled_rendering = has_ext("GL_QCOM_tiled_rendering");
    GLAD_GL_OES_stencil4 = has_ext("GL_OES_stencil4");
    GLAD_GL_OES_stencil1 = has_ext("GL_OES_stencil1");
    GLAD_GL_ARM_rgba8 = has_ext("GL_ARM_rgba8");
    GLAD_GL_EXT_robustness = has_ext("GL_EXT_robustness");
    GLAD_GL_EXT_sRGB = has_ext("GL_EXT_sRGB");
    GLAD_GL_OES_compressed_ETC1_RGB8_sub_texture =
         has_ext("GL_OES_compressed_ETC1_RGB8_sub_texture");
    GLAD_GL_OES_rgb8_rgba8 = has_ext("GL_OES_rgb8_rgba8");
    GLAD_GL_OES_fbo_render_mipmap = has_ext("GL_OES_fbo_render_mipmap");
    GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
    GLAD_GL_OES_vertex_array_object = has_ext("GL_OES_vertex_array_object");
    GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
    GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
    GLAD_GL_IMG_read_format = has_ext("GL_IMG_read_format");
    GLAD_GL_OES_depth24 = has_ext("GL_OES_depth24");
    GLAD_GL_APPLE_sync = has_ext("GL_APPLE_sync");
    GLAD_GL_EXT_texture_storage = has_ext("GL_EXT_texture_storage");
    GLAD_GL_AMD_compressed_ATC_texture = has_ext("GL_AMD_compressed_ATC_texture");
    GLAD_GL_QCOM_driver_control = has_ext("GL_QCOM_driver_control");
    GLAD_GL_IMG_texture_compression_pvrtc = has_ext("GL_IMG_texture_compression_pvrtc");
    if (GLAD_GL_OVR_multiview != 0) {
      glad_glFramebufferTextureMultiviewOVR =
           (PFNGLFRAMEBUFFERTEXTUREMULTIVIEWOVRPROC)(*load)("glFramebufferTextureMultiviewOVR");
    }
    load_GL_EXT_multi_draw_arrays(load);
    load_GL_NV_conditional_render(load);
    load_GL_EXT_separate_shader_objects(load);
    load_GL_AMD_performance_monitor(load);
    load_GL_KHR_robustness(load);
    if (GLAD_GL_NV_fragment_coverage_to_color != 0) {
      glad_glFragmentCoverageColorNV =
           (PFNGLFRAGMENTCOVERAGECOLORNVPROC)(*load)("glFragmentCoverageColorNV");
    }
    load_GL_NV_fence(load);
    load_GL_NV_blend_equation_advanced(load);
    load_GL_NV_bindless_texture(load);
    load_GL_KHR_debug(load);
    if (GLAD_GL_KHR_blend_equation_advanced != 0) {
      glad_glBlendBarrierKHR = (PFNGLBLENDBARRIERKHRPROC)(*load)("glBlendBarrierKHR");
    }
    if (GLAD_GL_EXT_texture_filter_minmax != 0) {
      glad_glRasterSamplesEXT = (PFNGLRASTERSAMPLESEXTPROC)(*load)("glRasterSamplesEXT");
    }
    if (GLAD_GL_EXT_blend_minmax != 0) {
      glad_glBlendEquationEXT = (PFNGLBLENDEQUATIONEXTPROC)(*load)("glBlendEquationEXT");
    }
    load_GL_NV_framebuffer_mixed_samples(load);
    if (GLAD_GL_EXT_raster_multisample != 0) {
      glad_glRasterSamplesEXT = (PFNGLRASTERSAMPLESEXTPROC)(*load)("glRasterSamplesEXT");
    }
    load_GL_EXT_debug_marker(load);
    load_GL_INTEL_performance_query(load);
    load_GL_EXT_debug_label(load);
    if (GLAD_GL_NV_internalformat_sample_query != 0) {
      glad_glGetInternalformatSampleivNV =
           (PFNGLGETINTERNALFORMATSAMPLEIVNVPROC)(*load)("glGetInternalformatSampleivNV");
    }
    load_GL_EXT_draw_instanced(load);
    if (GLAD_GL_NV_conservative_raster != 0) {
      glad_glSubpixelPrecisionBiasNV =
           (PFNGLSUBPIXELPRECISIONBIASNVPROC)(*load)("glSubpixelPrecisionBiasNV");
    }
    load_GL_NV_path_rendering(load);
    load_GL_NV_sample_locations(load);
    if (GLAD_GL_NV_non_square_matrices != 0) {
      glad_glUniformMatrix2x3fvNV = (PFNGLUNIFORMMATRIX2X3FVNVPROC)(*load)("glUniformMatrix2x3fvNV")
      ;
      glad_glUniformMatrix3x2fvNV = (PFNGLUNIFORMMATRIX3X2FVNVPROC)(*load)("glUniformMatrix3x2fvNV")
      ;
      glad_glUniformMatrix2x4fvNV = (PFNGLUNIFORMMATRIX2X4FVNVPROC)(*load)("glUniformMatrix2x4fvNV")
      ;
      glad_glUniformMatrix4x2fvNV = (PFNGLUNIFORMMATRIX4X2FVNVPROC)(*load)("glUniformMatrix4x2fvNV")
      ;
      glad_glUniformMatrix3x4fvNV = (PFNGLUNIFORMMATRIX3X4FVNVPROC)(*load)("glUniformMatrix3x4fvNV")
      ;
      glad_glUniformMatrix4x3fvNV = (PFNGLUNIFORMMATRIX4X3FVNVPROC)(*load)("glUniformMatrix4x3fvNV")
      ;
    }
    if (GLAD_GL_EXT_sparse_texture != 0) {
      glad_glTexPageCommitmentARB = (PFNGLTEXPAGECOMMITMENTARBPROC)(*load)("glTexPageCommitmentARB")
      ;
    }
    if (GLAD_GL_NV_draw_instanced != 0) {
      glad_glDrawArraysInstancedNV =
           (PFNGLDRAWARRAYSINSTANCEDNVPROC)(*load)("glDrawArraysInstancedNV");
      glad_glDrawElementsInstancedNV =
           (PFNGLDRAWELEMENTSINSTANCEDNVPROC)(*load)("glDrawElementsInstancedNV");
    }
    if (GLAD_GL_NV_fragment_coverage_to_color != 0) {
      glad_glFragmentCoverageColorNV =
           (PFNGLFRAGMENTCOVERAGECOLORNVPROC)(*load)("glFragmentCoverageColorNV");
    }
    load_GL_NV_fence(load);
    load_GL_NV_sample_locations(load);
    if (GLAD_GL_EXT_base_instance != 0) {
      glad_glDrawArraysInstancedBaseInstanceEXT =
           (PFNGLDRAWARRAYSINSTANCEDBASEINSTANCEEXTPROC)
           (*load)("glDrawArraysInstancedBaseInstanceEXT");
      glad_glDrawElementsInstancedBaseInstanceEXT =
           (PFNGLDRAWELEMENTSINSTANCEDBASEINSTANCEEXTPROC)
           (*load)("glDrawElementsInstancedBaseInstanceEXT");
      glad_glDrawElementsInstancedBaseVertexBaseInstanceEXT =
           (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCEEXTPROC)
           (*load)("glDrawElementsInstancedBaseVertexBaseInstanceEXT");
    }
    if (GLAD_GL_EXT_instanced_arrays != 0) {
      glad_glDrawArraysInstancedEXT =
           (PFNGLDRAWARRAYSINSTANCEDEXTPROC)(*load)("glDrawArraysInstancedEXT");
      glad_glDrawElementsInstancedEXT =
           (PFNGLDRAWELEMENTSINSTANCEDEXTPROC)(*load)("glDrawElementsInstancedEXT");
      glad_glVertexAttribDivisorEXT =
           (PFNGLVERTEXATTRIBDIVISOREXTPROC)(*load)("glVertexAttribDivisorEXT");
    }
    if (GLAD_GL_EXT_draw_buffers_indexed != 0) {
      glad_glEnableiEXT = (PFNGLENABLEIEXTPROC)(*load)("glEnableiEXT");
      glad_glDisableiEXT = (PFNGLDISABLEIEXTPROC)(*load)("glDisableiEXT");
      glad_glBlendEquationiEXT = (PFNGLBLENDEQUATIONIEXTPROC)(*load)("glBlendEquationiEXT");
      glad_glBlendEquationSeparateiEXT =
           (PFNGLBLENDEQUATIONSEPARATEIEXTPROC)(*load)("glBlendEquationSeparateiEXT");
      glad_glBlendFunciEXT = (PFNGLBLENDFUNCIEXTPROC)(*load)("glBlendFunciEXT");
      glad_glBlendFuncSeparateiEXT =
           (PFNGLBLENDFUNCSEPARATEIEXTPROC)(*load)("glBlendFuncSeparateiEXT");
      glad_glColorMaskiEXT = (PFNGLCOLORMASKIEXTPROC)(*load)("glColorMaskiEXT");
      glad_glIsEnablediEXT = (PFNGLISENABLEDIEXTPROC)(*load)("glIsEnablediEXT");
    }
    if (GLAD_GL_OVR_multiview != 0) {
      glad_glFramebufferTextureMultiviewOVR =
           (PFNGLFRAMEBUFFERTEXTUREMULTIVIEWOVRPROC)(*load)("glFramebufferTextureMultiviewOVR");
    }
    if (GLAD_GL_ANGLE_translated_shader_source != 0) {
      glad_glGetTranslatedShaderSourceANGLE =
           (PFNGLGETTRANSLATEDSHADERSOURCEANGLEPROC)(*load)("glGetTranslatedShaderSourceANGLE");
    }
    if (GLAD_GL_NV_coverage_sample != 0) {
      glad_glCoverageMaskNV = (PFNGLCOVERAGEMASKNVPROC)(*load)("glCoverageMaskNV");
      glad_glCoverageOperationNV = (PFNGLCOVERAGEOPERATIONNVPROC)(*load)("glCoverageOperationNV");
    }
    if (GLAD_GL_ANGLE_framebuffer_multisample != 0) {
      glad_glRenderbufferStorageMultisampleANGLE =
           (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEANGLEPROC)
           (*load)("glRenderbufferStorageMultisampleANGLE");
    }
    load_GL_OES_vertex_array_object(load);
    load_GL_QCOM_tiled_rendering(load);
    load_GL_EXT_robustness(load);
    load_GL_KHR_robustness(load);
    if (GLAD_GL_EXT_disjoint_timer_query != 0) {
      glad_glGenQueriesEXT = (PFNGLGENQUERIESEXTPROC)(*load)("glGenQueriesEXT");
      glad_glDeleteQueriesEXT = (PFNGLDELETEQUERIESEXTPROC)(*load)("glDeleteQueriesEXT");
      glad_glIsQueryEXT = (PFNGLISQUERYEXTPROC)(*load)("glIsQueryEXT");
      glad_glBeginQueryEXT = (PFNGLBEGINQUERYEXTPROC)(*load)("glBeginQueryEXT");
      glad_glEndQueryEXT = (PFNGLENDQUERYEXTPROC)(*load)("glEndQueryEXT");
      glad_glQueryCounterEXT = (PFNGLQUERYCOUNTEREXTPROC)(*load)("glQueryCounterEXT");
      glad_glGetQueryivEXT = (PFNGLGETQUERYIVEXTPROC)(*load)("glGetQueryivEXT");
      glad_glGetQueryObjectivEXT = (PFNGLGETQUERYOBJECTIVEXTPROC)(*load)("glGetQueryObjectivEXT");
      glad_glGetQueryObjectuivEXT = (PFNGLGETQUERYOBJECTUIVEXTPROC)(*load)("glGetQueryObjectuivEXT")
      ;
      glad_glGetQueryObjecti64vEXT =
           (PFNGLGETQUERYOBJECTI64VEXTPROC)(*load)("glGetQueryObjecti64vEXT");
      glad_glGetQueryObjectui64vEXT =
           (PFNGLGETQUERYOBJECTUI64VEXTPROC)(*load)("glGetQueryObjectui64vEXT");
    }
    if (GLAD_GL_NV_conservative_raster != 0) {
      glad_glSubpixelPrecisionBiasNV =
           (PFNGLSUBPIXELPRECISIONBIASNVPROC)(*load)("glSubpixelPrecisionBiasNV");
    }
    if (GLAD_GL_EXT_primitive_bounding_box != 0) {
      glad_glPrimitiveBoundingBoxEXT =
           (PFNGLPRIMITIVEBOUNDINGBOXEXTPROC)(*load)("glPrimitiveBoundingBoxEXT");
    }
    load_GL_NV_framebuffer_mixed_samples(load);
    load_GL_EXT_multi_draw_arrays(load);
    if (GLAD_GL_EXT_raster_multisample != 0) {
      glad_glRasterSamplesEXT = (PFNGLRASTERSAMPLESEXTPROC)(*load)("glRasterSamplesEXT");
    }
    load_GL_QCOM_driver_control(load);
    load_GL_EXT_debug_marker(load);
    if (GLAD_GL_OES_geometry_shader != 0) {
      glad_glFramebufferTextureOES =
           (PFNGLFRAMEBUFFERTEXTUREOESPROC)(*load)("glFramebufferTextureOES");
    }
    if (GLAD_GL_OES_tessellation_shader != 0) {
      glad_glPatchParameteriOES = (PFNGLPATCHPARAMETERIOESPROC)(*load)("glPatchParameteriOES");
    }
    if (GLAD_GL_OES_texture_view != 0) {
      glad_glTextureViewOES = (PFNGLTEXTUREVIEWOESPROC)(*load)("glTextureViewOES");
    }
    load_GL_EXT_multisampled_render_to_texture(load);
    if (GLAD_GL_EXT_buffer_storage != 0) {
      glad_glBufferStorageEXT = (PFNGLBUFFERSTORAGEEXTPROC)(*load)("glBufferStorageEXT");
    }
    if (GLAD_GL_OES_texture_buffer != 0) {
      glad_glTexBufferOES = (PFNGLTEXBUFFEROESPROC)(*load)("glTexBufferOES");
      glad_glTexBufferRangeOES = (PFNGLTEXBUFFERRANGEOESPROC)(*load)("glTexBufferRangeOES");
    }
    if (GLAD_GL_OES_get_program_binary != 0) {
      glad_glGetProgramBinaryOES = (PFNGLGETPROGRAMBINARYOESPROC)(*load)("glGetProgramBinaryOES");
      glad_glProgramBinaryOES = (PFNGLPROGRAMBINARYOESPROC)(*load)("glProgramBinaryOES");
    }
    load_GL_APPLE_framebuffer_multisample(load);
    if (GLAD_GL_NV_copy_buffer != 0) {
      glad_glCopyBufferSubDataNV = (PFNGLCOPYBUFFERSUBDATANVPROC)(*load)("glCopyBufferSubDataNV");
    }
    if (GLAD_GL_EXT_texture_view != 0) {
      glad_glTextureViewEXT = (PFNGLTEXTUREVIEWEXTPROC)(*load)("glTextureViewEXT");
    }
    if (GLAD_GL_NV_framebuffer_blit != 0) {
      glad_glBlitFramebufferNV = (PFNGLBLITFRAMEBUFFERNVPROC)(*load)("glBlitFramebufferNV");
    }
    if (GLAD_GL_QCOM_alpha_test != 0) {
      glad_glAlphaFuncQCOM = (PFNGLALPHAFUNCQCOMPROC)(*load)("glAlphaFuncQCOM");
    }
    load_GL_INTEL_performance_query(load);
    load_GL_KHR_debug(load);
    if (GLAD_GL_OES_texture_border_clamp != 0) {
      glad_glTexParameterIivOES = (PFNGLTEXPARAMETERIIVOESPROC)(*load)("glTexParameterIivOES");
      glad_glTexParameterIuivOES = (PFNGLTEXPARAMETERIUIVOESPROC)(*load)("glTexParameterIuivOES");
      glad_glGetTexParameterIivOES =
           (PFNGLGETTEXPARAMETERIIVOESPROC)(*load)("glGetTexParameterIivOES");
      glad_glGetTexParameterIuivOES =
           (PFNGLGETTEXPARAMETERIUIVOESPROC)(*load)("glGetTexParameterIuivOES");
      glad_glSamplerParameterIivOES =
           (PFNGLSAMPLERPARAMETERIIVOESPROC)(*load)("glSamplerParameterIivOES");
      glad_glSamplerParameterIuivOES =
           (PFNGLSAMPLERPARAMETERIUIVOESPROC)(*load)("glSamplerParameterIuivOES");
      glad_glGetSamplerParameterIivOES =
           (PFNGLGETSAMPLERPARAMETERIIVOESPROC)(*load)("glGetSamplerParameterIivOES");
      glad_glGetSamplerParameterIuivOES =
           (PFNGLGETSAMPLERPARAMETERIUIVOESPROC)(*load)("glGetSamplerParameterIuivOES");
    }
    if (GLAD_GL_EXT_occlusion_query_boolean != 0) {
      glad_glGenQueriesEXT = (PFNGLGENQUERIESEXTPROC)(*load)("glGenQueriesEXT");
      glad_glDeleteQueriesEXT = (PFNGLDELETEQUERIESEXTPROC)(*load)("glDeleteQueriesEXT");
      glad_glIsQueryEXT = (PFNGLISQUERYEXTPROC)(*load)("glIsQueryEXT");
      glad_glBeginQueryEXT = (PFNGLBEGINQUERYEXTPROC)(*load)("glBeginQueryEXT");
      glad_glEndQueryEXT = (PFNGLENDQUERYEXTPROC)(*load)("glEndQueryEXT");
      glad_glGetQueryivEXT = (PFNGLGETQUERYIVEXTPROC)(*load)("glGetQueryivEXT");
      glad_glGetQueryObjectuivEXT = (PFNGLGETQUERYOBJECTUIVEXTPROC)(*load)("glGetQueryObjectuivEXT")
      ;
    }
    load_GL_NV_bindless_texture(load);
    if (GLAD_GL_EXT_multi_draw_indirect != 0) {
      glad_glMultiDrawArraysIndirectEXT =
           (PFNGLMULTIDRAWARRAYSINDIRECTEXTPROC)(*load)("glMultiDrawArraysIndirectEXT");
      glad_glMultiDrawElementsIndirectEXT =
           (PFNGLMULTIDRAWELEMENTSINDIRECTEXTPROC)(*load)("glMultiDrawElementsIndirectEXT");
    }
    if (GLAD_GL_KHR_blend_equation_advanced != 0) {
      glad_glBlendBarrierKHR = (PFNGLBLENDBARRIERKHRPROC)(*load)("glBlendBarrierKHR");
    }
    load_GL_APPLE_sync(load);
    if (GLAD_GL_OES_copy_image != 0) {
      glad_glCopyImageSubDataOES = (PFNGLCOPYIMAGESUBDATAOESPROC)(*load)("glCopyImageSubDataOES");
    }
    load_GL_QCOM_extended_get2(load);
    if (GLAD_GL_EXT_draw_elements_base_vertex != 0) {
      glad_glDrawElementsBaseVertexEXT =
           (PFNGLDRAWELEMENTSBASEVERTEXEXTPROC)(*load)("glDrawElementsBaseVertexEXT");
      glad_glDrawRangeElementsBaseVertexEXT =
           (PFNGLDRAWRANGEELEMENTSBASEVERTEXEXTPROC)(*load)("glDrawRangeElementsBaseVertexEXT");
      glad_glDrawElementsInstancedBaseVertexEXT =
           (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXEXTPROC)
           (*load)("glDrawElementsInstancedBaseVertexEXT");
      glad_glMultiDrawElementsBaseVertexEXT =
           (PFNGLMULTIDRAWELEMENTSBASEVERTEXEXTPROC)(*load)("glMultiDrawElementsBaseVertexEXT");
    }
    load_GL_EXT_separate_shader_objects(load);
    if (GLAD_GL_NV_framebuffer_multisample != 0) {
      glad_glRenderbufferStorageMultisampleNV =
           (PFNGLRENDERBUFFERSTORAGEMULTISAMPLENVPROC)(*load)("glRenderbufferStorageMultisampleNV");
    }
    if (GLAD_GL_EXT_texture_filter_minmax != 0) {
      glad_glRasterSamplesEXT = (PFNGLRASTERSAMPLESEXTPROC)(*load)("glRasterSamplesEXT");
    }
    load_GL_NV_path_rendering(load);
    if (GLAD_GL_OES_texture_storage_multisample_2d_array != 0) {
      glad_glTexStorage3DMultisampleOES =
           (PFNGLTEXSTORAGE3DMULTISAMPLEOESPROC)(*load)("glTexStorage3DMultisampleOES");
    }
    if (GLAD_GL_OES_draw_buffers_indexed != 0) {
      glad_glEnableiOES = (PFNGLENABLEIOESPROC)(*load)("glEnableiOES");
      glad_glDisableiOES = (PFNGLDISABLEIOESPROC)(*load)("glDisableiOES");
      glad_glBlendEquationiOES = (PFNGLBLENDEQUATIONIOESPROC)(*load)("glBlendEquationiOES");
      glad_glBlendEquationSeparateiOES =
           (PFNGLBLENDEQUATIONSEPARATEIOESPROC)(*load)("glBlendEquationSeparateiOES");
      glad_glBlendFunciOES = (PFNGLBLENDFUNCIOESPROC)(*load)("glBlendFunciOES");
      glad_glBlendFuncSeparateiOES =
           (PFNGLBLENDFUNCSEPARATEIOESPROC)(*load)("glBlendFuncSeparateiOES");
      glad_glColorMaskiOES = (PFNGLCOLORMASKIOESPROC)(*load)("glColorMaskiOES");
      glad_glIsEnablediOES = (PFNGLISENABLEDIOESPROC)(*load)("glIsEnablediOES");
    }
    load_GL_OES_EGL_image(load);
    if (GLAD_GL_NV_draw_buffers != 0) {
      glad_glDrawBuffersNV = (PFNGLDRAWBUFFERSNVPROC)(*load)("glDrawBuffersNV");
    }
    load_GL_NV_blend_equation_advanced(load);
    if (GLAD_GL_EXT_draw_buffers != 0) {
      glad_glDrawBuffersEXT = (PFNGLDRAWBUFFERSEXTPROC)(*load)("glDrawBuffersEXT");
    }
    load_GL_EXT_debug_label(load);
    load_GL_NV_conditional_render(load);
    if (GLAD_GL_EXT_blend_minmax != 0) {
      glad_glBlendEquationEXT = (PFNGLBLENDEQUATIONEXTPROC)(*load)("glBlendEquationEXT");
    }
    if (GLAD_GL_NV_internalformat_sample_query != 0) {
      glad_glGetInternalformatSampleivNV =
           (PFNGLGETINTERNALFORMATSAMPLEIVNVPROC)(*load)("glGetInternalformatSampleivNV");
    }
    if (GLAD_GL_NV_instanced_arrays != 0) {
      glad_glVertexAttribDivisorNV =
           (PFNGLVERTEXATTRIBDIVISORNVPROC)(*load)("glVertexAttribDivisorNV");
    }
    load_GL_EXT_texture_storage(load);
    if (GLAD_GL_EXT_copy_image != 0) {
      glad_glCopyImageSubDataEXT = (PFNGLCOPYIMAGESUBDATAEXTPROC)(*load)("glCopyImageSubDataEXT");
    }
    if (GLAD_GL_OES_sample_shading != 0) {
      glad_glMinSampleShadingOES = (PFNGLMINSAMPLESHADINGOESPROC)(*load)("glMinSampleShadingOES");
    }
    if (GLAD_GL_NV_viewport_array != 0) {
      glad_glViewportArrayvNV = (PFNGLVIEWPORTARRAYVNVPROC)(*load)("glViewportArrayvNV");
      glad_glViewportIndexedfNV = (PFNGLVIEWPORTINDEXEDFNVPROC)(*load)("glViewportIndexedfNV");
      glad_glViewportIndexedfvNV = (PFNGLVIEWPORTINDEXEDFVNVPROC)(*load)("glViewportIndexedfvNV");
      glad_glScissorArrayvNV = (PFNGLSCISSORARRAYVNVPROC)(*load)("glScissorArrayvNV");
      glad_glScissorIndexedNV = (PFNGLSCISSORINDEXEDNVPROC)(*load)("glScissorIndexedNV");
      glad_glScissorIndexedvNV = (PFNGLSCISSORINDEXEDVNVPROC)(*load)("glScissorIndexedvNV");
      glad_glDepthRangeArrayfvNV = (PFNGLDEPTHRANGEARRAYFVNVPROC)(*load)("glDepthRangeArrayfvNV");
      glad_glDepthRangeIndexedfNV = (PFNGLDEPTHRANGEINDEXEDFNVPROC)(*load)("glDepthRangeIndexedfNV")
      ;
      glad_glGetFloati_vNV = (PFNGLGETFLOATI_VNVPROC)(*load)("glGetFloati_vNV");
      glad_glEnableiNV = (PFNGLENABLEINVPROC)(*load)("glEnableiNV");
      glad_glDisableiNV = (PFNGLDISABLEINVPROC)(*load)("glDisableiNV");
      glad_glIsEnablediNV = (PFNGLISENABLEDINVPROC)(*load)("glIsEnablediNV");
    }
    load_GL_EXT_map_buffer_range(load);
    load_GL_OES_mapbuffer(load);
    if (GLAD_GL_NV_polygon_mode != 0) {
      glad_glPolygonModeNV = (PFNGLPOLYGONMODENVPROC)(*load)("glPolygonModeNV");
    }
    load_GL_AMD_performance_monitor(load);
    load_GL_IMG_multisampled_render_to_texture(load);
    if (GLAD_GL_OES_draw_elements_base_vertex != 0) {
      glad_glDrawElementsBaseVertexOES =
           (PFNGLDRAWELEMENTSBASEVERTEXOESPROC)(*load)("glDrawElementsBaseVertexOES");
      glad_glDrawRangeElementsBaseVertexOES =
           (PFNGLDRAWRANGEELEMENTSBASEVERTEXOESPROC)(*load)("glDrawRangeElementsBaseVertexOES");
      glad_glDrawElementsInstancedBaseVertexOES =
           (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXOESPROC)
           (*load)("glDrawElementsInstancedBaseVertexOES");
      glad_glMultiDrawElementsBaseVertexOES =
           (PFNGLMULTIDRAWELEMENTSBASEVERTEXOESPROC)(*load)("glMultiDrawElementsBaseVertexOES");
    }
    if (GLAD_GL_APPLE_copy_texture_levels != 0) {
      glad_glCopyTextureLevelsAPPLE =
           (PFNGLCOPYTEXTURELEVELSAPPLEPROC)(*load)("glCopyTextureLevelsAPPLE");
    }
    if (GLAD_GL_EXT_multiview_draw_buffers != 0) {
      glad_glReadBufferIndexedEXT = (PFNGLREADBUFFERINDEXEDEXTPROC)(*load)("glReadBufferIndexedEXT")
      ;
      glad_glDrawBuffersIndexedEXT =
           (PFNGLDRAWBUFFERSINDEXEDEXTPROC)(*load)("glDrawBuffersIndexedEXT");
      glad_glGetIntegeri_vEXT = (PFNGLGETINTEGERI_VEXTPROC)(*load)("glGetIntegeri_vEXT");
    }
    load_GL_QCOM_extended_get(load);
    if (GLAD_GL_EXT_geometry_shader != 0) {
      glad_glFramebufferTextureEXT =
           (PFNGLFRAMEBUFFERTEXTUREEXTPROC)(*load)("glFramebufferTextureEXT");
    }
    if (GLAD_GL_EXT_texture_border_clamp != 0) {
      glad_glTexParameterIivEXT = (PFNGLTEXPARAMETERIIVEXTPROC)(*load)("glTexParameterIivEXT");
      glad_glTexParameterIuivEXT = (PFNGLTEXPARAMETERIUIVEXTPROC)(*load)("glTexParameterIuivEXT");
      glad_glGetTexParameterIivEXT =
           (PFNGLGETTEXPARAMETERIIVEXTPROC)(*load)("glGetTexParameterIivEXT");
      glad_glGetTexParameterIuivEXT =
           (PFNGLGETTEXPARAMETERIUIVEXTPROC)(*load)("glGetTexParameterIuivEXT");
      glad_glSamplerParameterIivEXT =
           (PFNGLSAMPLERPARAMETERIIVEXTPROC)(*load)("glSamplerParameterIivEXT");
      glad_glSamplerParameterIuivEXT =
           (PFNGLSAMPLERPARAMETERIUIVEXTPROC)(*load)("glSamplerParameterIuivEXT");
      glad_glGetSamplerParameterIivEXT =
           (PFNGLGETSAMPLERPARAMETERIIVEXTPROC)(*load)("glGetSamplerParameterIivEXT");
      glad_glGetSamplerParameterIuivEXT =
           (PFNGLGETSAMPLERPARAMETERIUIVEXTPROC)(*load)("glGetSamplerParameterIuivEXT");
    }
    if (GLAD_GL_ANGLE_framebuffer_blit != 0) {
      glad_glBlitFramebufferANGLE = (PFNGLBLITFRAMEBUFFERANGLEPROC)(*load)("glBlitFramebufferANGLE")
      ;
    }
    load_GL_EXT_draw_instanced(load);
    if (GLAD_GL_OES_texture_3D != 0) {
      glad_glTexImage3DOES = (PFNGLTEXIMAGE3DOESPROC)(*load)("glTexImage3DOES");
      glad_glTexSubImage3DOES = (PFNGLTEXSUBIMAGE3DOESPROC)(*load)("glTexSubImage3DOES");
      glad_glCopyTexSubImage3DOES = (PFNGLCOPYTEXSUBIMAGE3DOESPROC)(*load)("glCopyTexSubImage3DOES")
      ;
      glad_glCompressedTexImage3DOES =
           (PFNGLCOMPRESSEDTEXIMAGE3DOESPROC)(*load)("glCompressedTexImage3DOES");
      glad_glCompressedTexSubImage3DOES =
           (PFNGLCOMPRESSEDTEXSUBIMAGE3DOESPROC)(*load)("glCompressedTexSubImage3DOES");
      glad_glFramebufferTexture3DOES =
           (PFNGLFRAMEBUFFERTEXTURE3DOESPROC)(*load)("glFramebufferTexture3DOES");
    }
    if (GLAD_GL_EXT_tessellation_shader != 0) {
      glad_glPatchParameteriEXT = (PFNGLPATCHPARAMETERIEXTPROC)(*load)("glPatchParameteriEXT");
    }
    if (GLAD_GL_OES_primitive_bounding_box != 0) {
      glad_glPrimitiveBoundingBoxOES =
           (PFNGLPRIMITIVEBOUNDINGBOXOESPROC)(*load)("glPrimitiveBoundingBoxOES");
    }
    if (GLAD_GL_NV_read_buffer != 0) {
      glad_glReadBufferNV = (PFNGLREADBUFFERNVPROC)(*load)("glReadBufferNV");
    }
    if (GLAD_GL_ANGLE_instanced_arrays != 0) {
      glad_glDrawArraysInstancedANGLE =
           (PFNGLDRAWARRAYSINSTANCEDANGLEPROC)(*load)("glDrawArraysInstancedANGLE");
      glad_glDrawElementsInstancedANGLE =
           (PFNGLDRAWELEMENTSINSTANCEDANGLEPROC)(*load)("glDrawElementsInstancedANGLE");
      glad_glVertexAttribDivisorANGLE =
           (PFNGLVERTEXATTRIBDIVISORANGLEPROC)(*load)("glVertexAttribDivisorANGLE");
    }
    if (GLAD_GL_EXT_discard_framebuffer != 0) {
      glad_glDiscardFramebufferEXT =
           (PFNGLDISCARDFRAMEBUFFEREXTPROC)(*load)("glDiscardFramebufferEXT");
    }
    if (GLAD_GL_EXT_texture_buffer != 0) {
      glad_glTexBufferEXT = (PFNGLTEXBUFFEREXTPROC)(*load)("glTexBufferEXT");
      glad_glTexBufferRangeEXT = (PFNGLTEXBUFFERRANGEEXTPROC)(*load)("glTexBufferRangeEXT");
    }
    load_GL_EXT_multi_draw_arrays(load);
    load_GL_NV_fence(load);
    load_GL_EXT_map_buffer_range(load);
    load_GL_QCOM_extended_get2(load);
    load_GL_EXT_multisampled_render_to_texture(load);
    if (GLAD_GL_EXT_discard_framebuffer != 0) {
      glad_glDiscardFramebufferEXT =
           (PFNGLDISCARDFRAMEBUFFEREXTPROC)(*load)("glDiscardFramebufferEXT");
    }
    load_GL_OES_mapbuffer(load);
    load_GL_IMG_multisampled_render_to_texture(load);
    load_GL_APPLE_framebuffer_multisample(load);
    if (GLAD_GL_APPLE_copy_texture_levels != 0) {
      glad_glCopyTextureLevelsAPPLE =
           (PFNGLCOPYTEXTURELEVELSAPPLEPROC)(*load)("glCopyTextureLevelsAPPLE");
    }
    load_GL_OES_EGL_image(load);
    load_GL_QCOM_extended_get(load);
    load_GL_QCOM_tiled_rendering(load);
    load_GL_EXT_robustness(load);
    load_GL_OES_vertex_array_object(load);
    if (GLAD_GL_EXT_blend_minmax != 0) {
      glad_glBlendEquationEXT = (PFNGLBLENDEQUATIONEXTPROC)(*load)("glBlendEquationEXT");
    }
    load_GL_APPLE_sync(load);
    load_GL_EXT_texture_storage(load);
    load_GL_QCOM_driver_control(load);
    uVar3 = (uint)(GLVersion.minor != 0 || GLVersion.major != 0);
  }
  return uVar3;
}

Assistant:

int gladLoadGLES2Loader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGLES2();
	load_GL_ES_VERSION_2_0(load);
	load_GL_ES_VERSION_3_0(load);
	load_GL_ES_VERSION_3_1(load);

	find_extensionsGLES2();
	load_GL_OVR_multiview(load);
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_NV_conditional_render(load);
	load_GL_EXT_separate_shader_objects(load);
	load_GL_AMD_performance_monitor(load);
	load_GL_KHR_robustness(load);
	load_GL_NV_fragment_coverage_to_color(load);
	load_GL_NV_fence(load);
	load_GL_NV_blend_equation_advanced(load);
	load_GL_NV_bindless_texture(load);
	load_GL_KHR_debug(load);
	load_GL_KHR_blend_equation_advanced(load);
	load_GL_EXT_texture_filter_minmax(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_NV_framebuffer_mixed_samples(load);
	load_GL_EXT_raster_multisample(load);
	load_GL_EXT_debug_marker(load);
	load_GL_INTEL_performance_query(load);
	load_GL_EXT_debug_label(load);
	load_GL_NV_internalformat_sample_query(load);
	load_GL_EXT_draw_instanced(load);
	load_GL_NV_conservative_raster(load);
	load_GL_NV_path_rendering(load);
	load_GL_NV_sample_locations(load);
	load_GL_NV_non_square_matrices(load);
	load_GL_EXT_sparse_texture(load);
	load_GL_NV_draw_instanced(load);
	load_GL_NV_fragment_coverage_to_color(load);
	load_GL_NV_fence(load);
	load_GL_NV_sample_locations(load);
	load_GL_EXT_base_instance(load);
	load_GL_EXT_instanced_arrays(load);
	load_GL_EXT_draw_buffers_indexed(load);
	load_GL_OVR_multiview(load);
	load_GL_ANGLE_translated_shader_source(load);
	load_GL_NV_coverage_sample(load);
	load_GL_ANGLE_framebuffer_multisample(load);
	load_GL_OES_vertex_array_object(load);
	load_GL_QCOM_tiled_rendering(load);
	load_GL_EXT_robustness(load);
	load_GL_KHR_robustness(load);
	load_GL_EXT_disjoint_timer_query(load);
	load_GL_NV_conservative_raster(load);
	load_GL_EXT_primitive_bounding_box(load);
	load_GL_NV_framebuffer_mixed_samples(load);
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_EXT_raster_multisample(load);
	load_GL_QCOM_driver_control(load);
	load_GL_EXT_debug_marker(load);
	load_GL_OES_geometry_shader(load);
	load_GL_OES_tessellation_shader(load);
	load_GL_OES_texture_view(load);
	load_GL_EXT_multisampled_render_to_texture(load);
	load_GL_EXT_buffer_storage(load);
	load_GL_OES_texture_buffer(load);
	load_GL_OES_get_program_binary(load);
	load_GL_APPLE_framebuffer_multisample(load);
	load_GL_NV_copy_buffer(load);
	load_GL_EXT_texture_view(load);
	load_GL_NV_framebuffer_blit(load);
	load_GL_QCOM_alpha_test(load);
	load_GL_INTEL_performance_query(load);
	load_GL_KHR_debug(load);
	load_GL_OES_texture_border_clamp(load);
	load_GL_EXT_occlusion_query_boolean(load);
	load_GL_NV_bindless_texture(load);
	load_GL_EXT_multi_draw_indirect(load);
	load_GL_KHR_blend_equation_advanced(load);
	load_GL_APPLE_sync(load);
	load_GL_OES_copy_image(load);
	load_GL_QCOM_extended_get2(load);
	load_GL_EXT_draw_elements_base_vertex(load);
	load_GL_EXT_separate_shader_objects(load);
	load_GL_NV_framebuffer_multisample(load);
	load_GL_EXT_texture_filter_minmax(load);
	load_GL_NV_path_rendering(load);
	load_GL_OES_texture_storage_multisample_2d_array(load);
	load_GL_OES_draw_buffers_indexed(load);
	load_GL_OES_EGL_image(load);
	load_GL_NV_draw_buffers(load);
	load_GL_NV_blend_equation_advanced(load);
	load_GL_EXT_draw_buffers(load);
	load_GL_EXT_debug_label(load);
	load_GL_NV_conditional_render(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_NV_internalformat_sample_query(load);
	load_GL_NV_instanced_arrays(load);
	load_GL_EXT_texture_storage(load);
	load_GL_EXT_copy_image(load);
	load_GL_OES_sample_shading(load);
	load_GL_NV_viewport_array(load);
	load_GL_EXT_map_buffer_range(load);
	load_GL_OES_mapbuffer(load);
	load_GL_NV_polygon_mode(load);
	load_GL_AMD_performance_monitor(load);
	load_GL_IMG_multisampled_render_to_texture(load);
	load_GL_OES_draw_elements_base_vertex(load);
	load_GL_APPLE_copy_texture_levels(load);
	load_GL_EXT_multiview_draw_buffers(load);
	load_GL_QCOM_extended_get(load);
	load_GL_EXT_geometry_shader(load);
	load_GL_EXT_texture_border_clamp(load);
	load_GL_ANGLE_framebuffer_blit(load);
	load_GL_EXT_draw_instanced(load);
	load_GL_OES_texture_3D(load);
	load_GL_EXT_tessellation_shader(load);
	load_GL_OES_primitive_bounding_box(load);
	load_GL_NV_read_buffer(load);
	load_GL_ANGLE_instanced_arrays(load);
	load_GL_EXT_discard_framebuffer(load);
	load_GL_EXT_texture_buffer(load);
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_NV_fence(load);
	load_GL_EXT_map_buffer_range(load);
	load_GL_QCOM_extended_get2(load);
	load_GL_EXT_multisampled_render_to_texture(load);
	load_GL_EXT_discard_framebuffer(load);
	load_GL_OES_mapbuffer(load);
	load_GL_IMG_multisampled_render_to_texture(load);
	load_GL_APPLE_framebuffer_multisample(load);
	load_GL_APPLE_copy_texture_levels(load);
	load_GL_OES_EGL_image(load);
	load_GL_QCOM_extended_get(load);
	load_GL_QCOM_tiled_rendering(load);
	load_GL_EXT_robustness(load);
	load_GL_OES_vertex_array_object(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_APPLE_sync(load);
	load_GL_EXT_texture_storage(load);
	load_GL_QCOM_driver_control(load);
	return GLVersion.major != 0 || GLVersion.minor != 0;
}